

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<4,16>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  long lVar1;
  long lVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  Primitive PVar5;
  uint uVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  undefined8 uVar13;
  undefined8 uVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  byte bVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar25;
  ulong uVar26;
  long lVar27;
  uint uVar28;
  long lVar29;
  uint uVar30;
  bool bVar31;
  bool bVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar90 [64];
  undefined1 auVar92 [64];
  undefined1 auVar94 [64];
  undefined1 auVar96 [64];
  undefined1 auVar98 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  int iVar102;
  float fVar103;
  undefined4 uVar104;
  float fVar109;
  vint4 bi_2;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [64];
  vint4 bi_1;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  vint4 bi;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar128;
  float fVar144;
  float fVar145;
  undefined1 auVar130 [16];
  float fVar146;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  vint4 ai_2;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  vint4 ai_1;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar181;
  vint4 ai;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar182;
  float fVar196;
  float fVar197;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar198;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  __m128 a;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar214 [16];
  undefined1 auVar218 [32];
  float fVar219;
  float fVar220;
  float fVar230;
  float fVar232;
  vfloat4 a0_2;
  undefined1 auVar221 [16];
  float fVar231;
  float fVar233;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  float fVar234;
  float fVar235;
  float fVar236;
  vfloat4 a0_3;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  vfloat4 b0_2;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [48];
  vfloat4 b0_3;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  undefined1 auVar272 [64];
  int iVar273;
  undefined1 in_ZMM31 [64];
  undefined1 auVar274 [64];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  bool local_785;
  float local_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  uint auStack_620 [4];
  RTCFilterFunctionNArguments local_610;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  undefined1 local_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  uint uStack_460;
  float afStack_45c [7];
  undefined1 local_440 [64];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar24;
  undefined1 auVar85 [64];
  undefined1 auVar89 [64];
  undefined1 auVar91 [64];
  undefined1 auVar93 [64];
  undefined1 auVar95 [64];
  undefined1 auVar97 [64];
  undefined1 auVar99 [64];
  float fVar129;
  
  PVar5 = prim[1];
  uVar23 = (ulong)(byte)PVar5;
  lVar27 = uVar23 * 0x25;
  fVar103 = *(float *)(prim + lVar27 + 0x12);
  auVar34 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar35 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar35 = vinsertps_avx(auVar35,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar34 = vsubps_avx(auVar34,*(undefined1 (*) [16])(prim + lVar27 + 6));
  auVar57._0_4_ = fVar103 * auVar34._0_4_;
  auVar57._4_4_ = fVar103 * auVar34._4_4_;
  auVar57._8_4_ = fVar103 * auVar34._8_4_;
  auVar57._12_4_ = fVar103 * auVar34._12_4_;
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 4 + 6)));
  auVar37._0_4_ = fVar103 * auVar35._0_4_;
  auVar37._4_4_ = fVar103 * auVar35._4_4_;
  auVar37._8_4_ = fVar103 * auVar35._8_4_;
  auVar37._12_4_ = fVar103 * auVar35._12_4_;
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 5 + 6)));
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar43 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 6 + 6)));
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0xf + 6)));
  auVar43 = vcvtdq2ps_avx(auVar43);
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar49 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + 6)));
  auVar49 = vcvtdq2ps_avx(auVar49);
  auVar46 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar23 + 6)));
  auVar46 = vcvtdq2ps_avx(auVar46);
  auVar47 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0x1a + 6)));
  auVar47 = vcvtdq2ps_avx(auVar47);
  auVar48 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0x1b + 6)));
  auVar48 = vcvtdq2ps_avx(auVar48);
  auVar50 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar23 * 0x1c + 6)));
  auVar50 = vcvtdq2ps_avx(auVar50);
  auVar154._4_4_ = auVar37._0_4_;
  auVar154._0_4_ = auVar37._0_4_;
  auVar154._8_4_ = auVar37._0_4_;
  auVar154._12_4_ = auVar37._0_4_;
  auVar51 = vshufps_avx(auVar37,auVar37,0x55);
  auVar52 = vshufps_avx(auVar37,auVar37,0xaa);
  fVar103 = auVar52._0_4_;
  auVar59._0_4_ = fVar103 * auVar43._0_4_;
  fVar109 = auVar52._4_4_;
  auVar59._4_4_ = fVar109 * auVar43._4_4_;
  fVar236 = auVar52._8_4_;
  auVar59._8_4_ = fVar236 * auVar43._8_4_;
  fVar220 = auVar52._12_4_;
  auVar59._12_4_ = fVar220 * auVar43._12_4_;
  auVar45._0_4_ = auVar46._0_4_ * fVar103;
  auVar45._4_4_ = auVar46._4_4_ * fVar109;
  auVar45._8_4_ = auVar46._8_4_ * fVar236;
  auVar45._12_4_ = auVar46._12_4_ * fVar220;
  auVar38._0_4_ = auVar50._0_4_ * fVar103;
  auVar38._4_4_ = auVar50._4_4_ * fVar109;
  auVar38._8_4_ = auVar50._8_4_ * fVar236;
  auVar38._12_4_ = auVar50._12_4_ * fVar220;
  auVar52 = vfmadd231ps_fma(auVar59,auVar51,auVar35);
  auVar53 = vfmadd231ps_fma(auVar45,auVar51,auVar49);
  auVar51 = vfmadd231ps_fma(auVar38,auVar48,auVar51);
  auVar54 = vfmadd231ps_fma(auVar52,auVar154,auVar34);
  auVar53 = vfmadd231ps_fma(auVar53,auVar154,auVar42);
  auVar55 = vfmadd231ps_fma(auVar51,auVar47,auVar154);
  auVar257._4_4_ = auVar57._0_4_;
  auVar257._0_4_ = auVar57._0_4_;
  auVar257._8_4_ = auVar57._0_4_;
  auVar257._12_4_ = auVar57._0_4_;
  auVar51 = vshufps_avx(auVar57,auVar57,0x55);
  auVar52 = vshufps_avx(auVar57,auVar57,0xaa);
  fVar103 = auVar52._0_4_;
  auVar155._0_4_ = fVar103 * auVar43._0_4_;
  fVar109 = auVar52._4_4_;
  auVar155._4_4_ = fVar109 * auVar43._4_4_;
  fVar236 = auVar52._8_4_;
  auVar155._8_4_ = fVar236 * auVar43._8_4_;
  fVar220 = auVar52._12_4_;
  auVar155._12_4_ = fVar220 * auVar43._12_4_;
  auVar147._0_4_ = auVar46._0_4_ * fVar103;
  auVar147._4_4_ = auVar46._4_4_ * fVar109;
  auVar147._8_4_ = auVar46._8_4_ * fVar236;
  auVar147._12_4_ = auVar46._12_4_ * fVar220;
  auVar130._0_4_ = auVar50._0_4_ * fVar103;
  auVar130._4_4_ = auVar50._4_4_ * fVar109;
  auVar130._8_4_ = auVar50._8_4_ * fVar236;
  auVar130._12_4_ = auVar50._12_4_ * fVar220;
  auVar35 = vfmadd231ps_fma(auVar155,auVar51,auVar35);
  auVar43 = vfmadd231ps_fma(auVar147,auVar51,auVar49);
  auVar49 = vfmadd231ps_fma(auVar130,auVar51,auVar48);
  auVar36 = vfmadd231ps_fma(auVar35,auVar257,auVar34);
  auVar37 = vfmadd231ps_fma(auVar43,auVar257,auVar42);
  auVar34 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar270 = ZEXT1664(auVar34);
  auVar38 = vfmadd231ps_fma(auVar49,auVar257,auVar47);
  auVar35 = vandps_avx512vl(auVar54,auVar34);
  auVar183._8_4_ = 0x219392ef;
  auVar183._0_8_ = 0x219392ef219392ef;
  auVar183._12_4_ = 0x219392ef;
  uVar33 = vcmpps_avx512vl(auVar35,auVar183,1);
  bVar31 = (bool)((byte)uVar33 & 1);
  auVar39._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar54._0_4_;
  bVar31 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar39._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar54._4_4_;
  bVar31 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar39._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar54._8_4_;
  bVar31 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar39._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar54._12_4_;
  auVar35 = vandps_avx512vl(auVar53,auVar34);
  uVar33 = vcmpps_avx512vl(auVar35,auVar183,1);
  bVar31 = (bool)((byte)uVar33 & 1);
  auVar40._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar53._0_4_;
  bVar31 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar40._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar53._4_4_;
  bVar31 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar40._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar53._8_4_;
  bVar31 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar40._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar53._12_4_;
  auVar34 = vandps_avx512vl(auVar55,auVar34);
  uVar33 = vcmpps_avx512vl(auVar34,auVar183,1);
  bVar31 = (bool)((byte)uVar33 & 1);
  auVar41._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar55._0_4_;
  bVar31 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar41._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar55._4_4_;
  bVar31 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar41._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar55._8_4_;
  bVar31 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar41._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar55._12_4_;
  auVar35 = vrcp14ps_avx512vl(auVar39);
  auVar184._8_4_ = 0x3f800000;
  auVar184._0_8_ = &DAT_3f8000003f800000;
  auVar184._12_4_ = 0x3f800000;
  auVar34 = vfnmadd213ps_fma(auVar39,auVar35,auVar184);
  auVar54 = vfmadd132ps_fma(auVar34,auVar35,auVar35);
  auVar35 = vrcp14ps_avx512vl(auVar40);
  auVar34 = vfnmadd213ps_fma(auVar40,auVar35,auVar184);
  auVar55 = vfmadd132ps_fma(auVar34,auVar35,auVar35);
  auVar35 = vrcp14ps_avx512vl(auVar41);
  auVar34 = vfnmadd213ps_fma(auVar41,auVar35,auVar184);
  auVar16 = vfmadd132ps_fma(auVar34,auVar35,auVar35);
  fVar103 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar27 + 0x16)) *
            *(float *)(prim + lVar27 + 0x1a);
  auVar171._4_4_ = fVar103;
  auVar171._0_4_ = fVar103;
  auVar171._8_4_ = fVar103;
  auVar171._12_4_ = fVar103;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar23 * 7 + 6);
  auVar34 = vpmovsxwd_avx(auVar34);
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar23 * 0xb + 6);
  auVar35 = vpmovsxwd_avx(auVar35);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar42 = vsubps_avx(auVar35,auVar34);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar23 * 9 + 6);
  auVar35 = vpmovsxwd_avx(auVar43);
  auVar43 = vfmadd213ps_fma(auVar42,auVar171,auVar34);
  auVar34 = vcvtdq2ps_avx(auVar35);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar23 * 0xd + 6);
  auVar35 = vpmovsxwd_avx(auVar42);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar34);
  auVar42 = vfmadd213ps_fma(auVar35,auVar171,auVar34);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar23 * 0x12 + 6);
  auVar34 = vpmovsxwd_avx(auVar49);
  auVar34 = vcvtdq2ps_avx(auVar34);
  uVar33 = (ulong)(uint)((int)(uVar23 * 5) << 2);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar23 * 2 + uVar33 + 6);
  auVar35 = vpmovsxwd_avx(auVar46);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar34);
  auVar49 = vfmadd213ps_fma(auVar35,auVar171,auVar34);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar33 + 6);
  auVar34 = vpmovsxwd_avx(auVar47);
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar23 * 0x18 + 6);
  auVar35 = vpmovsxwd_avx(auVar48);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar34);
  auVar46 = vfmadd213ps_fma(auVar35,auVar171,auVar34);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar23 * 0x1d + 6);
  auVar34 = vpmovsxwd_avx(auVar50);
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar23 + (ulong)(byte)PVar5 * 0x20 + 6);
  auVar35 = vpmovsxwd_avx(auVar51);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar34);
  auVar47 = vfmadd213ps_fma(auVar35,auVar171,auVar34);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar5 * 0x20 - uVar23) + 6);
  auVar34 = vpmovsxwd_avx(auVar52);
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar23 * 0x23 + 6);
  auVar35 = vpmovsxwd_avx(auVar53);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar34);
  auVar35 = vfmadd213ps_fma(auVar35,auVar171,auVar34);
  auVar34 = vsubps_avx(auVar43,auVar36);
  auVar172._0_4_ = auVar54._0_4_ * auVar34._0_4_;
  auVar172._4_4_ = auVar54._4_4_ * auVar34._4_4_;
  auVar172._8_4_ = auVar54._8_4_ * auVar34._8_4_;
  auVar172._12_4_ = auVar54._12_4_ * auVar34._12_4_;
  auVar34 = vsubps_avx(auVar42,auVar36);
  auVar56._0_4_ = auVar54._0_4_ * auVar34._0_4_;
  auVar56._4_4_ = auVar54._4_4_ * auVar34._4_4_;
  auVar56._8_4_ = auVar54._8_4_ * auVar34._8_4_;
  auVar56._12_4_ = auVar54._12_4_ * auVar34._12_4_;
  auVar34 = vsubps_avx(auVar49,auVar37);
  auVar156._0_4_ = auVar55._0_4_ * auVar34._0_4_;
  auVar156._4_4_ = auVar55._4_4_ * auVar34._4_4_;
  auVar156._8_4_ = auVar55._8_4_ * auVar34._8_4_;
  auVar156._12_4_ = auVar55._12_4_ * auVar34._12_4_;
  auVar34 = vsubps_avx(auVar46,auVar37);
  auVar58._0_4_ = auVar55._0_4_ * auVar34._0_4_;
  auVar58._4_4_ = auVar55._4_4_ * auVar34._4_4_;
  auVar58._8_4_ = auVar55._8_4_ * auVar34._8_4_;
  auVar58._12_4_ = auVar55._12_4_ * auVar34._12_4_;
  auVar34 = vsubps_avx(auVar47,auVar38);
  auVar60._0_4_ = auVar16._0_4_ * auVar34._0_4_;
  auVar60._4_4_ = auVar16._4_4_ * auVar34._4_4_;
  auVar60._8_4_ = auVar16._8_4_ * auVar34._8_4_;
  auVar60._12_4_ = auVar16._12_4_ * auVar34._12_4_;
  auVar34 = vsubps_avx(auVar35,auVar38);
  auVar44._0_4_ = auVar16._0_4_ * auVar34._0_4_;
  auVar44._4_4_ = auVar16._4_4_ * auVar34._4_4_;
  auVar44._8_4_ = auVar16._8_4_ * auVar34._8_4_;
  auVar44._12_4_ = auVar16._12_4_ * auVar34._12_4_;
  auVar34 = vpminsd_avx(auVar172,auVar56);
  auVar35 = vpminsd_avx(auVar156,auVar58);
  auVar34 = vmaxps_avx(auVar34,auVar35);
  auVar35 = vpminsd_avx(auVar60,auVar44);
  uVar104 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar54._4_4_ = uVar104;
  auVar54._0_4_ = uVar104;
  auVar54._8_4_ = uVar104;
  auVar54._12_4_ = uVar104;
  auVar35 = vmaxps_avx512vl(auVar35,auVar54);
  auVar34 = vmaxps_avx(auVar34,auVar35);
  auVar55._8_4_ = 0x3f7ffffa;
  auVar55._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar55._12_4_ = 0x3f7ffffa;
  local_5a0 = vmulps_avx512vl(auVar34,auVar55);
  auVar34 = vpmaxsd_avx(auVar172,auVar56);
  auVar35 = vpmaxsd_avx(auVar156,auVar58);
  auVar34 = vminps_avx(auVar34,auVar35);
  auVar35 = vpmaxsd_avx(auVar60,auVar44);
  uVar104 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar16._4_4_ = uVar104;
  auVar16._0_4_ = uVar104;
  auVar16._8_4_ = uVar104;
  auVar16._12_4_ = uVar104;
  auVar35 = vminps_avx512vl(auVar35,auVar16);
  auVar34 = vminps_avx(auVar34,auVar35);
  auVar36._8_4_ = 0x3f800003;
  auVar36._0_8_ = 0x3f8000033f800003;
  auVar36._12_4_ = 0x3f800003;
  auVar34 = vmulps_avx512vl(auVar34,auVar36);
  auVar35 = vpbroadcastd_avx512vl();
  uVar13 = vcmpps_avx512vl(local_5a0,auVar34,2);
  uVar33 = vpcmpgtd_avx512vl(auVar35,_DAT_01ff0cf0);
  uVar33 = ((byte)uVar13 & 0xf) & uVar33;
  bVar31 = (char)uVar33 == '\0';
  local_785 = !bVar31;
  if (bVar31) {
    return local_785;
  }
  auVar108 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar108);
  auVar34 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar274 = ZEXT1664(auVar34);
  auVar34 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar108 = ZEXT1664(auVar34);
LAB_01c2b4a1:
  lVar27 = 0;
  for (uVar23 = uVar33; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
    lVar27 = lVar27 + 1;
  }
  uVar30 = *(uint *)(prim + 2);
  pGVar7 = (context->scene->geometries).items[uVar30].ptr;
  fVar103 = (pGVar7->time_range).lower;
  fVar103 = pGVar7->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x1c0) - fVar103) / ((pGVar7->time_range).upper - fVar103));
  auVar34 = vroundss_avx(ZEXT416((uint)fVar103),ZEXT416((uint)fVar103),9);
  auVar34 = vminss_avx(auVar34,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar36 = vmaxss_avx512f(auVar274._0_16_,auVar34);
  uVar23 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)*(uint *)(prim + lVar27 * 4 + 6) *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar29 = (long)(int)auVar36._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + lVar29);
  lVar10 = *(long *)(_Var8 + 0x10 + lVar29);
  auVar34 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar23);
  lVar27 = uVar23 + 1;
  auVar35 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar27);
  lVar1 = uVar23 + 2;
  auVar43 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  lVar2 = uVar23 + 3;
  auVar42 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar2);
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar10 = *(long *)(lVar9 + lVar29);
  lVar11 = *(long *)(lVar9 + 0x10 + lVar29);
  auVar49 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar23);
  auVar46 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar27);
  auVar47 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  auVar48 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)(_Var8 + 0x38 + lVar29);
  lVar11 = *(long *)(_Var8 + 0x48 + lVar29);
  auVar50 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar23);
  auVar51 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar27);
  auVar52 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  auVar53 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  auVar82 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar82);
  lVar10 = *(long *)(lVar9 + 0x38 + lVar29);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar29);
  auVar54 = *(undefined1 (*) [16])(lVar10 + uVar23 * lVar9);
  auVar265 = auVar82._16_48_;
  auVar55 = *(undefined1 (*) [16])(lVar10 + lVar27 * lVar9);
  auVar16 = *(undefined1 (*) [16])(lVar10 + lVar1 * lVar9);
  auVar36 = vsubss_avx512f(ZEXT416((uint)fVar103),auVar36);
  auVar82._0_16_ = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
  auVar37 = vmulps_avx512vl(auVar42,auVar82._0_16_);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar43,auVar82._0_16_);
  auVar38 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar38 = vfmadd213ps_avx512vl(auVar38,auVar35,auVar37);
  auVar38 = vaddps_avx512vl(auVar34,auVar38);
  auVar58 = auVar108._0_16_;
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar35,auVar58);
  auVar37 = vfnmadd231ps_avx512vl(auVar37,auVar34,auVar58);
  auVar39 = vmulps_avx512vl(auVar48,auVar82._0_16_);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar47,auVar82._0_16_);
  auVar40 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
  auVar40 = vfmadd213ps_avx512vl(auVar40,auVar46,auVar39);
  auVar41 = vaddps_avx512vl(auVar49,auVar40);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar46,auVar58);
  auVar39 = vfnmadd231ps_avx512vl(auVar39,auVar49,auVar58);
  auVar40 = vxorps_avx512vl(auVar40,auVar40);
  auVar40 = vfmadd213ps_avx512vl(auVar40,auVar43,auVar42);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar35,auVar82._0_16_);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar34,auVar82._0_16_);
  auVar42 = vmulps_avx512vl(auVar42,auVar58);
  auVar43 = vfnmadd231ps_avx512vl(auVar42,auVar58,auVar43);
  auVar35 = vfmadd231ps_avx512vl(auVar43,auVar82._0_16_,auVar35);
  auVar44 = vfnmadd231ps_avx512vl(auVar35,auVar82._0_16_,auVar34);
  auVar34 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar47,auVar48);
  auVar34 = vfmadd231ps_avx512vl(auVar34,auVar46,auVar82._0_16_);
  auVar45 = vfmadd231ps_avx512vl(auVar34,auVar49,auVar82._0_16_);
  auVar34 = vmulps_avx512vl(auVar48,auVar58);
  auVar34 = vfnmadd231ps_avx512vl(auVar34,auVar58,auVar47);
  auVar34 = vfmadd231ps_avx512vl(auVar34,auVar82._0_16_,auVar46);
  auVar46 = vfnmadd231ps_avx512vl(auVar34,auVar82._0_16_,auVar49);
  auVar34 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar35 = vshufps_avx512vl(auVar41,auVar41,0xc9);
  fVar128 = auVar37._0_4_;
  auVar157._0_4_ = fVar128 * auVar35._0_4_;
  fVar144 = auVar37._4_4_;
  auVar157._4_4_ = fVar144 * auVar35._4_4_;
  fVar145 = auVar37._8_4_;
  auVar157._8_4_ = fVar145 * auVar35._8_4_;
  fVar146 = auVar37._12_4_;
  auVar157._12_4_ = fVar146 * auVar35._12_4_;
  auVar35 = vfmsub231ps_avx512vl(auVar157,auVar34,auVar41);
  auVar43 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar35 = vshufps_avx512vl(auVar39,auVar39,0xc9);
  auVar173._0_4_ = fVar128 * auVar35._0_4_;
  auVar173._4_4_ = fVar144 * auVar35._4_4_;
  auVar173._8_4_ = fVar145 * auVar35._8_4_;
  auVar173._12_4_ = fVar146 * auVar35._12_4_;
  auVar34 = vfmsub231ps_avx512vl(auVar173,auVar34,auVar39);
  auVar42 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar34 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar35 = vshufps_avx(auVar45,auVar45,0xc9);
  fVar103 = auVar44._0_4_;
  auVar199._0_4_ = auVar35._0_4_ * fVar103;
  fVar109 = auVar44._4_4_;
  auVar199._4_4_ = auVar35._4_4_ * fVar109;
  fVar236 = auVar44._8_4_;
  auVar199._8_4_ = auVar35._8_4_ * fVar236;
  fVar220 = auVar44._12_4_;
  auVar199._12_4_ = auVar35._12_4_ * fVar220;
  auVar35 = vfmsub231ps_fma(auVar199,auVar34,auVar45);
  auVar49 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar35 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar200._0_4_ = auVar35._0_4_ * fVar103;
  auVar200._4_4_ = auVar35._4_4_ * fVar109;
  auVar200._8_4_ = auVar35._8_4_ * fVar236;
  auVar200._12_4_ = auVar35._12_4_ * fVar220;
  auVar34 = vfmsub231ps_fma(auVar200,auVar34,auVar46);
  auVar46 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar34 = vdpps_avx(auVar43,auVar43,0x7f);
  auVar82._16_48_ = auVar265;
  auVar108._4_60_ = auVar82._4_60_;
  auVar108._0_4_ = auVar34._0_4_;
  auVar35 = vrsqrt14ss_avx512f(auVar82._0_16_,auVar108._0_16_);
  auVar47 = vmulss_avx512f(auVar35,ZEXT416(0x3fc00000));
  auVar48 = vmulss_avx512f(auVar34,ZEXT416(0x3f000000));
  auVar48 = vmulss_avx512f(auVar48,auVar35);
  auVar35 = vmulss_avx512f(auVar48,ZEXT416((uint)(auVar35._0_4_ * auVar35._0_4_)));
  auVar35 = vsubss_avx512f(auVar47,auVar35);
  auVar210._0_4_ = auVar35._0_4_;
  auVar210._4_4_ = auVar210._0_4_;
  auVar210._8_4_ = auVar210._0_4_;
  auVar210._12_4_ = auVar210._0_4_;
  auVar47 = vmulps_avx512vl(auVar43,auVar210);
  auVar35 = vdpps_avx(auVar43,auVar42,0x7f);
  auVar48 = vbroadcastss_avx512vl(auVar34);
  auVar42 = vmulps_avx512vl(auVar48,auVar42);
  fVar231 = auVar35._0_4_;
  auVar158._0_4_ = fVar231 * auVar43._0_4_;
  auVar158._4_4_ = fVar231 * auVar43._4_4_;
  auVar158._8_4_ = fVar231 * auVar43._8_4_;
  auVar158._12_4_ = fVar231 * auVar43._12_4_;
  auVar43 = vsubps_avx(auVar42,auVar158);
  auVar35 = vrcp14ss_avx512f(auVar82._0_16_,auVar108._0_16_);
  auVar34 = vfnmadd213ss_avx512f(auVar34,auVar35,ZEXT416(0x40000000));
  fVar231 = auVar35._0_4_ * auVar34._0_4_;
  auVar34 = vdpps_avx(auVar49,auVar49,0x7f);
  auVar272._16_48_ = auVar265;
  auVar272._0_16_ = auVar82._0_16_;
  auVar271._4_60_ = auVar272._4_60_;
  auVar271._0_4_ = auVar34._0_4_;
  auVar35 = vrsqrt14ss_avx512f(auVar82._0_16_,auVar271._0_16_);
  auVar42 = vmulss_avx512f(auVar35,ZEXT416(0x3fc00000));
  auVar48 = vmulss_avx512f(auVar34,ZEXT416(0x3f000000));
  fVar232 = auVar35._0_4_;
  fVar129 = auVar42._0_4_ - auVar48._0_4_ * fVar232 * fVar232 * fVar232;
  auVar211._0_4_ = fVar129 * auVar49._0_4_;
  auVar211._4_4_ = fVar129 * auVar49._4_4_;
  auVar211._8_4_ = fVar129 * auVar49._8_4_;
  auVar211._12_4_ = fVar129 * auVar49._12_4_;
  auVar35 = vdpps_avx(auVar49,auVar46,0x7f);
  auVar42 = vbroadcastss_avx512vl(auVar34);
  auVar42 = vmulps_avx512vl(auVar42,auVar46);
  fVar232 = auVar35._0_4_;
  auVar105._0_4_ = fVar232 * auVar49._0_4_;
  auVar105._4_4_ = fVar232 * auVar49._4_4_;
  auVar105._8_4_ = fVar232 * auVar49._8_4_;
  auVar105._12_4_ = fVar232 * auVar49._12_4_;
  auVar35 = vsubps_avx(auVar42,auVar105);
  auVar42 = vrcp14ss_avx512f(auVar82._0_16_,auVar271._0_16_);
  auVar34 = vfnmadd213ss_avx512f(auVar34,auVar42,ZEXT416(0x40000000));
  fVar232 = auVar42._0_4_ * auVar34._0_4_;
  auVar42 = vshufps_avx512vl(auVar38,auVar38,0xff);
  auVar49 = vmulps_avx512vl(auVar42,auVar47);
  auVar46 = vsubps_avx512vl(auVar38,auVar49);
  auVar34 = vshufps_avx(auVar37,auVar37,0xff);
  auVar34 = vmulps_avx512vl(auVar34,auVar47);
  auVar148._0_4_ = auVar34._0_4_ + auVar42._0_4_ * auVar210._0_4_ * fVar231 * auVar43._0_4_;
  auVar148._4_4_ = auVar34._4_4_ + auVar42._4_4_ * auVar210._0_4_ * fVar231 * auVar43._4_4_;
  auVar148._8_4_ = auVar34._8_4_ + auVar42._8_4_ * auVar210._0_4_ * fVar231 * auVar43._8_4_;
  auVar148._12_4_ = auVar34._12_4_ + auVar42._12_4_ * auVar210._0_4_ * fVar231 * auVar43._12_4_;
  auVar34 = vsubps_avx(auVar37,auVar148);
  auVar47 = vaddps_avx512vl(auVar38,auVar49);
  auVar43 = vshufps_avx512vl(auVar40,auVar40,0xff);
  auVar244._0_4_ = auVar211._0_4_ * auVar43._0_4_;
  auVar244._4_4_ = auVar211._4_4_ * auVar43._4_4_;
  auVar244._8_4_ = auVar211._8_4_ * auVar43._8_4_;
  auVar244._12_4_ = auVar211._12_4_ * auVar43._12_4_;
  auVar48 = vsubps_avx512vl(auVar40,auVar244);
  auVar42 = vshufps_avx512vl(auVar44,auVar44,0xff);
  auVar49 = vmulps_avx512vl(auVar42,auVar211);
  auVar159._0_4_ = auVar49._0_4_ + auVar43._0_4_ * fVar129 * auVar35._0_4_ * fVar232;
  auVar159._4_4_ = auVar49._4_4_ + auVar43._4_4_ * fVar129 * auVar35._4_4_ * fVar232;
  auVar159._8_4_ = auVar49._8_4_ + auVar43._8_4_ * fVar129 * auVar35._8_4_ * fVar232;
  auVar159._12_4_ = auVar49._12_4_ + auVar43._12_4_ * fVar129 * auVar35._12_4_ * fVar232;
  auVar35 = vsubps_avx(auVar44,auVar159);
  auVar37 = vaddps_avx512vl(auVar40,auVar244);
  auVar185._0_4_ = auVar46._0_4_ + auVar34._0_4_ * 0.33333334;
  auVar185._4_4_ = auVar46._4_4_ + auVar34._4_4_ * 0.33333334;
  auVar185._8_4_ = auVar46._8_4_ + auVar34._8_4_ * 0.33333334;
  auVar185._12_4_ = auVar46._12_4_ + auVar34._12_4_ * 0.33333334;
  auVar160._0_4_ = auVar35._0_4_ * 0.33333334;
  auVar160._4_4_ = auVar35._4_4_ * 0.33333334;
  auVar160._8_4_ = auVar35._8_4_ * 0.33333334;
  auVar160._12_4_ = auVar35._12_4_ * 0.33333334;
  auVar49 = vsubps_avx(auVar48,auVar160);
  auVar161._0_4_ = (fVar128 + auVar148._0_4_) * 0.33333334;
  auVar161._4_4_ = (fVar144 + auVar148._4_4_) * 0.33333334;
  auVar161._8_4_ = (fVar145 + auVar148._8_4_) * 0.33333334;
  auVar161._12_4_ = (fVar146 + auVar148._12_4_) * 0.33333334;
  auVar38 = vaddps_avx512vl(auVar47,auVar161);
  auVar174._0_4_ = (fVar103 + auVar159._0_4_) * 0.33333334;
  auVar174._4_4_ = (fVar109 + auVar159._4_4_) * 0.33333334;
  auVar174._8_4_ = (fVar236 + auVar159._8_4_) * 0.33333334;
  auVar174._12_4_ = (fVar220 + auVar159._12_4_) * 0.33333334;
  auVar39 = vsubps_avx512vl(auVar37,auVar174);
  auVar34 = *(undefined1 (*) [16])(lVar10 + lVar9 * lVar2);
  auVar35 = vmulps_avx512vl(auVar53,auVar82._0_16_);
  auVar35 = vfmadd231ps_avx512vl(auVar35,auVar52,auVar82._0_16_);
  auVar43 = vxorps_avx512vl(auVar42,auVar42);
  auVar43 = vfmadd213ps_avx512vl(auVar43,auVar51,auVar35);
  auVar41 = vaddps_avx512vl(auVar50,auVar43);
  auVar35 = vfmadd231ps_avx512vl(auVar35,auVar51,auVar58);
  auVar44 = vfnmadd231ps_avx512vl(auVar35,auVar50,auVar58);
  auVar35 = vmulps_avx512vl(auVar34,auVar82._0_16_);
  auVar35 = vfmadd231ps_avx512vl(auVar35,auVar16,auVar82._0_16_);
  auVar43 = vxorps_avx512vl(auVar40,auVar40);
  auVar43 = vfmadd213ps_avx512vl(auVar43,auVar55,auVar35);
  auVar42 = vaddps_avx512vl(auVar54,auVar43);
  auVar35 = vfmadd231ps_avx512vl(auVar35,auVar55,auVar58);
  auVar35 = vfnmadd231ps_avx512vl(auVar35,auVar54,auVar58);
  auVar43 = vxorps_avx512vl(auVar43,auVar43);
  auVar43 = vfmadd213ps_avx512vl(auVar43,auVar52,auVar53);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar51,auVar82._0_16_);
  auVar40 = vfmadd231ps_avx512vl(auVar43,auVar50,auVar82._0_16_);
  auVar43 = vmulps_avx512vl(auVar53,auVar58);
  auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar58,auVar52);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar82._0_16_,auVar51);
  auVar50 = vfnmadd231ps_avx512vl(auVar43,auVar82._0_16_,auVar50);
  auVar43 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar16,auVar34);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar55,auVar82._0_16_);
  auVar51 = vfmadd231ps_avx512vl(auVar43,auVar54,auVar82._0_16_);
  auVar34 = vmulps_avx512vl(auVar34,auVar58);
  auVar34 = vfnmadd231ps_avx512vl(auVar34,auVar58,auVar16);
  auVar34 = vfmadd231ps_avx512vl(auVar34,auVar82._0_16_,auVar55);
  auVar52 = vfnmadd231ps_avx512vl(auVar34,auVar82._0_16_,auVar54);
  auVar34 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar43 = vshufps_avx512vl(auVar42,auVar42,0xc9);
  fVar236 = auVar44._0_4_;
  auVar258._0_4_ = fVar236 * auVar43._0_4_;
  fVar220 = auVar44._4_4_;
  auVar258._4_4_ = fVar220 * auVar43._4_4_;
  fVar231 = auVar44._8_4_;
  auVar258._8_4_ = fVar231 * auVar43._8_4_;
  fVar232 = auVar44._12_4_;
  auVar258._12_4_ = fVar232 * auVar43._12_4_;
  auVar43 = vfmsub231ps_avx512vl(auVar258,auVar34,auVar42);
  auVar43 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar42 = vshufps_avx512vl(auVar35,auVar35,0xc9);
  auVar266._0_4_ = fVar236 * auVar42._0_4_;
  auVar266._4_4_ = fVar220 * auVar42._4_4_;
  auVar266._8_4_ = fVar231 * auVar42._8_4_;
  auVar266._12_4_ = fVar232 * auVar42._12_4_;
  auVar34 = vfmsub231ps_avx512vl(auVar266,auVar34,auVar35);
  auVar42 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar35 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar34 = vshufps_avx512vl(auVar51,auVar51,0xc9);
  auVar34 = vmulps_avx512vl(auVar50,auVar34);
  auVar34 = vfmsub231ps_avx512vl(auVar34,auVar35,auVar51);
  auVar51 = vshufps_avx512vl(auVar34,auVar34,0xc9);
  auVar53 = vshufps_avx512vl(auVar52,auVar52,0xc9);
  auVar34 = vdpps_avx(auVar43,auVar43,0x7f);
  auVar53 = vmulps_avx512vl(auVar50,auVar53);
  auVar35 = vfmsub231ps_avx512vl(auVar53,auVar35,auVar52);
  auVar52 = vshufps_avx512vl(auVar35,auVar35,0xc9);
  auVar83._16_48_ = auVar265;
  auVar83._0_16_ = auVar82._0_16_;
  auVar100._4_60_ = auVar83._4_60_;
  auVar100._0_4_ = auVar34._0_4_;
  auVar35 = vrsqrt14ss_avx512f(auVar82._0_16_,auVar100._0_16_);
  auVar53 = vmulss_avx512f(auVar35,ZEXT416(0x3fc00000));
  auVar54 = vmulss_avx512f(auVar34,ZEXT416(0x3f000000));
  auVar54 = vmulss_avx512f(auVar54,auVar35);
  auVar35 = vmulss_avx512f(auVar35,auVar35);
  auVar35 = vmulss_avx512f(auVar54,auVar35);
  auVar35 = vsubss_avx512f(auVar53,auVar35);
  auVar53 = vbroadcastss_avx512vl(auVar35);
  auVar54 = vmulps_avx512vl(auVar43,auVar53);
  auVar35 = vdpps_avx(auVar43,auVar42,0x7f);
  auVar55 = vbroadcastss_avx512vl(auVar34);
  auVar42 = vmulps_avx512vl(auVar55,auVar42);
  fVar103 = auVar35._0_4_;
  auVar162._0_4_ = auVar43._0_4_ * fVar103;
  auVar162._4_4_ = auVar43._4_4_ * fVar103;
  auVar162._8_4_ = auVar43._8_4_ * fVar103;
  auVar162._12_4_ = auVar43._12_4_ * fVar103;
  auVar35 = vsubps_avx(auVar42,auVar162);
  auVar43 = vrcp14ss_avx512f(auVar82._0_16_,auVar100._0_16_);
  auVar34 = vfnmadd213ss_avx512f(auVar34,auVar43,ZEXT416(0x40000000));
  fVar103 = auVar43._0_4_ * auVar34._0_4_;
  auVar34 = vdpps_avx(auVar51,auVar51,0x7f);
  auVar110._0_4_ = fVar103 * auVar35._0_4_;
  auVar110._4_4_ = fVar103 * auVar35._4_4_;
  auVar110._8_4_ = fVar103 * auVar35._8_4_;
  auVar110._12_4_ = fVar103 * auVar35._12_4_;
  auVar43 = vmulps_avx512vl(auVar53,auVar110);
  auVar85._16_48_ = auVar265;
  auVar85._0_16_ = auVar82._0_16_;
  auVar84._4_60_ = auVar85._4_60_;
  auVar84._0_4_ = auVar34._0_4_;
  auVar35 = vrsqrt14ss_avx512f(auVar82._0_16_,auVar84._0_16_);
  auVar42 = vmulss_avx512f(auVar35,ZEXT416(0x3fc00000));
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar53 = vmulss_avx512f(auVar34,ZEXT416(0x3f000000));
  auVar271 = ZEXT464(0x3f800000);
  auVar53 = vmulss_avx512f(auVar53,auVar35);
  auVar35 = vmulss_avx512f(auVar53,ZEXT416((uint)(auVar35._0_4_ * auVar35._0_4_)));
  fVar109 = auVar42._0_4_ - auVar35._0_4_;
  auVar267._0_4_ = auVar51._0_4_ * fVar109;
  auVar267._4_4_ = auVar51._4_4_ * fVar109;
  auVar267._8_4_ = auVar51._8_4_ * fVar109;
  auVar267._12_4_ = auVar51._12_4_ * fVar109;
  auVar35 = vdpps_avx(auVar51,auVar52,0x7f);
  auVar42 = vbroadcastss_avx512vl(auVar34);
  auVar42 = vmulps_avx512vl(auVar42,auVar52);
  fVar103 = auVar35._0_4_;
  auVar175._0_4_ = auVar51._0_4_ * fVar103;
  auVar175._4_4_ = auVar51._4_4_ * fVar103;
  auVar175._8_4_ = auVar51._8_4_ * fVar103;
  auVar175._12_4_ = auVar51._12_4_ * fVar103;
  auVar35 = vsubps_avx(auVar42,auVar175);
  auVar42 = vrcp14ss_avx512f(auVar82._0_16_,auVar84._0_16_);
  auVar34 = vfnmadd213ss_avx512f(auVar34,auVar42,ZEXT416(0x40000000));
  fVar103 = auVar34._0_4_ * auVar42._0_4_;
  auVar42 = vshufps_avx512vl(auVar41,auVar41,0xff);
  auVar51 = vmulps_avx512vl(auVar42,auVar54);
  auVar52 = vsubps_avx512vl(auVar41,auVar51);
  auVar34 = vshufps_avx(auVar44,auVar44,0xff);
  auVar34 = vmulps_avx512vl(auVar34,auVar54);
  auVar111._0_4_ = auVar34._0_4_ + auVar42._0_4_ * auVar43._0_4_;
  auVar111._4_4_ = auVar34._4_4_ + auVar42._4_4_ * auVar43._4_4_;
  auVar111._8_4_ = auVar34._8_4_ + auVar42._8_4_ * auVar43._8_4_;
  auVar111._12_4_ = auVar34._12_4_ + auVar42._12_4_ * auVar43._12_4_;
  auVar34 = vsubps_avx(auVar44,auVar111);
  auVar43 = vaddps_avx512vl(auVar41,auVar51);
  auVar42 = vshufps_avx512vl(auVar40,auVar40,0xff);
  auVar245._0_4_ = auVar42._0_4_ * auVar267._0_4_;
  auVar245._4_4_ = auVar42._4_4_ * auVar267._4_4_;
  auVar245._8_4_ = auVar42._8_4_ * auVar267._8_4_;
  auVar245._12_4_ = auVar42._12_4_ * auVar267._12_4_;
  auVar51 = vsubps_avx512vl(auVar40,auVar245);
  auVar53 = vshufps_avx512vl(auVar50,auVar50,0xff);
  auVar53 = vmulps_avx512vl(auVar53,auVar267);
  auVar163._0_4_ = auVar53._0_4_ + auVar42._0_4_ * fVar109 * auVar35._0_4_ * fVar103;
  auVar163._4_4_ = auVar53._4_4_ + auVar42._4_4_ * fVar109 * auVar35._4_4_ * fVar103;
  auVar163._8_4_ = auVar53._8_4_ + auVar42._8_4_ * fVar109 * auVar35._8_4_ * fVar103;
  auVar163._12_4_ = auVar53._12_4_ + auVar42._12_4_ * fVar109 * auVar35._12_4_ * fVar103;
  auVar35 = vsubps_avx(auVar50,auVar163);
  auVar42 = vaddps_avx512vl(auVar40,auVar245);
  auVar176._0_4_ = auVar52._0_4_ + auVar34._0_4_ * 0.33333334;
  auVar176._4_4_ = auVar52._4_4_ + auVar34._4_4_ * 0.33333334;
  auVar176._8_4_ = auVar52._8_4_ + auVar34._8_4_ * 0.33333334;
  auVar176._12_4_ = auVar52._12_4_ + auVar34._12_4_ * 0.33333334;
  auVar212._0_4_ = auVar35._0_4_ * 0.33333334;
  auVar212._4_4_ = auVar35._4_4_ * 0.33333334;
  auVar212._8_4_ = auVar35._8_4_ * 0.33333334;
  auVar212._12_4_ = auVar35._12_4_ * 0.33333334;
  auVar34 = vsubps_avx(auVar51,auVar212);
  auVar112._0_4_ = auVar43._0_4_ + (fVar236 + auVar111._0_4_) * 0.33333334;
  auVar112._4_4_ = auVar43._4_4_ + (fVar220 + auVar111._4_4_) * 0.33333334;
  auVar112._8_4_ = auVar43._8_4_ + (fVar231 + auVar111._8_4_) * 0.33333334;
  auVar112._12_4_ = auVar43._12_4_ + (fVar232 + auVar111._12_4_) * 0.33333334;
  auVar164._0_4_ = (auVar50._0_4_ + auVar163._0_4_) * 0.33333334;
  auVar164._4_4_ = (auVar50._4_4_ + auVar163._4_4_) * 0.33333334;
  auVar164._8_4_ = (auVar50._8_4_ + auVar163._8_4_) * 0.33333334;
  auVar164._12_4_ = (auVar50._12_4_ + auVar163._12_4_) * 0.33333334;
  auVar35 = vsubps_avx(auVar42,auVar164);
  auVar50 = vbroadcastss_avx512vl(auVar36);
  auVar53 = vsubss_avx512f(ZEXT416(0x3f800000),auVar36);
  auVar268._0_4_ = auVar53._0_4_;
  auVar268._4_4_ = auVar268._0_4_;
  auVar268._8_4_ = auVar268._0_4_;
  auVar268._12_4_ = auVar268._0_4_;
  auVar52 = vmulps_avx512vl(auVar50,auVar52);
  auVar53 = vmulps_avx512vl(auVar50,auVar176);
  auVar34 = vmulps_avx512vl(auVar50,auVar34);
  auVar259._0_4_ = auVar50._0_4_ * auVar51._0_4_;
  auVar259._4_4_ = auVar50._4_4_ * auVar51._4_4_;
  auVar259._8_4_ = auVar50._8_4_ * auVar51._8_4_;
  auVar259._12_4_ = auVar50._12_4_ * auVar51._12_4_;
  local_520 = vfmadd231ps_avx512vl(auVar52,auVar268,auVar46);
  local_530 = vfmadd231ps_avx512vl(auVar53,auVar268,auVar185);
  local_540 = vfmadd231ps_avx512vl(auVar34,auVar268,auVar49);
  local_550 = vfmadd231ps_fma(auVar259,auVar268,auVar48);
  auVar34 = vmulps_avx512vl(auVar50,auVar43);
  auVar43 = vmulps_avx512vl(auVar50,auVar112);
  auVar35 = vmulps_avx512vl(auVar50,auVar35);
  auVar253._0_4_ = auVar50._0_4_ * auVar42._0_4_;
  auVar253._4_4_ = auVar50._4_4_ * auVar42._4_4_;
  auVar253._8_4_ = auVar50._8_4_ * auVar42._8_4_;
  auVar253._12_4_ = auVar50._12_4_ * auVar42._12_4_;
  _local_560 = vfmadd231ps_avx512vl(auVar34,auVar268,auVar47);
  _local_570 = vfmadd231ps_avx512vl(auVar43,auVar268,auVar38);
  _local_580 = vfmadd231ps_avx512vl(auVar35,auVar268,auVar39);
  _local_590 = vfmadd231ps_fma(auVar253,auVar268,auVar37);
  auVar34 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  local_4a0 = vsubps_avx512vl(local_520,auVar34);
  uVar104 = local_4a0._0_4_;
  auVar113._4_4_ = uVar104;
  auVar113._0_4_ = uVar104;
  auVar113._8_4_ = uVar104;
  auVar113._12_4_ = uVar104;
  auVar35 = vshufps_avx(local_4a0,local_4a0,0x55);
  auVar43 = vshufps_avx(local_4a0,local_4a0,0xaa);
  aVar3 = pre->ray_space[k].vx.field_0;
  aVar4 = pre->ray_space[k].vy.field_0;
  fVar103 = pre->ray_space[k].vz.field_0.m128[0];
  fVar109 = pre->ray_space[k].vz.field_0.m128[1];
  fVar236 = pre->ray_space[k].vz.field_0.m128[2];
  fVar220 = pre->ray_space[k].vz.field_0.m128[3];
  auVar106._0_4_ = fVar103 * auVar43._0_4_;
  auVar106._4_4_ = fVar109 * auVar43._4_4_;
  auVar106._8_4_ = fVar236 * auVar43._8_4_;
  auVar106._12_4_ = fVar220 * auVar43._12_4_;
  auVar35 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar4,auVar35);
  auVar48 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar3,auVar113);
  local_4b0 = vsubps_avx512vl(local_530,auVar34);
  uVar104 = local_4b0._0_4_;
  auVar131._4_4_ = uVar104;
  auVar131._0_4_ = uVar104;
  auVar131._8_4_ = uVar104;
  auVar131._12_4_ = uVar104;
  auVar35 = vshufps_avx(local_4b0,local_4b0,0x55);
  auVar43 = vshufps_avx(local_4b0,local_4b0,0xaa);
  auVar114._0_4_ = fVar103 * auVar43._0_4_;
  auVar114._4_4_ = fVar109 * auVar43._4_4_;
  auVar114._8_4_ = fVar236 * auVar43._8_4_;
  auVar114._12_4_ = fVar220 * auVar43._12_4_;
  auVar35 = vfmadd231ps_fma(auVar114,(undefined1  [16])aVar4,auVar35);
  auVar50 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar3,auVar131);
  local_4c0 = vsubps_avx512vl(local_540,auVar34);
  uVar104 = local_4c0._0_4_;
  auVar132._4_4_ = uVar104;
  auVar132._0_4_ = uVar104;
  auVar132._8_4_ = uVar104;
  auVar132._12_4_ = uVar104;
  auVar35 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar43 = vshufps_avx(local_4c0,local_4c0,0xaa);
  auVar201._0_4_ = auVar43._0_4_ * fVar103;
  auVar201._4_4_ = auVar43._4_4_ * fVar109;
  auVar201._8_4_ = auVar43._8_4_ * fVar236;
  auVar201._12_4_ = auVar43._12_4_ * fVar220;
  auVar35 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar4,auVar35);
  auVar51 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar3,auVar132);
  local_4d0 = vsubps_avx(local_550,auVar34);
  uVar104 = local_4d0._0_4_;
  auVar133._4_4_ = uVar104;
  auVar133._0_4_ = uVar104;
  auVar133._8_4_ = uVar104;
  auVar133._12_4_ = uVar104;
  auVar35 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar43 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar213._0_4_ = auVar43._0_4_ * fVar103;
  auVar213._4_4_ = auVar43._4_4_ * fVar109;
  auVar213._8_4_ = auVar43._8_4_ * fVar236;
  auVar213._12_4_ = auVar43._12_4_ * fVar220;
  auVar35 = vfmadd231ps_fma(auVar213,(undefined1  [16])aVar4,auVar35);
  auVar52 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar3,auVar133);
  local_4e0 = vsubps_avx512vl(_local_560,auVar34);
  uVar104 = local_4e0._0_4_;
  auVar134._4_4_ = uVar104;
  auVar134._0_4_ = uVar104;
  auVar134._8_4_ = uVar104;
  auVar134._12_4_ = uVar104;
  auVar35 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar43 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar221._0_4_ = auVar43._0_4_ * fVar103;
  auVar221._4_4_ = auVar43._4_4_ * fVar109;
  auVar221._8_4_ = auVar43._8_4_ * fVar236;
  auVar221._12_4_ = auVar43._12_4_ * fVar220;
  auVar35 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar4,auVar35);
  auVar53 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar3,auVar134);
  local_4f0 = vsubps_avx512vl(_local_570,auVar34);
  uVar104 = local_4f0._0_4_;
  auVar135._4_4_ = uVar104;
  auVar135._0_4_ = uVar104;
  auVar135._8_4_ = uVar104;
  auVar135._12_4_ = uVar104;
  auVar35 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar43 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar237._0_4_ = auVar43._0_4_ * fVar103;
  auVar237._4_4_ = auVar43._4_4_ * fVar109;
  auVar237._8_4_ = auVar43._8_4_ * fVar236;
  auVar237._12_4_ = auVar43._12_4_ * fVar220;
  auVar35 = vfmadd231ps_fma(auVar237,(undefined1  [16])aVar4,auVar35);
  auVar54 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar3,auVar135);
  local_500 = vsubps_avx512vl(_local_580,auVar34);
  uVar104 = local_500._0_4_;
  auVar136._4_4_ = uVar104;
  auVar136._0_4_ = uVar104;
  auVar136._8_4_ = uVar104;
  auVar136._12_4_ = uVar104;
  auVar35 = vshufps_avx(local_500,local_500,0x55);
  auVar43 = vshufps_avx(local_500,local_500,0xaa);
  auVar246._0_4_ = auVar43._0_4_ * fVar103;
  auVar246._4_4_ = auVar43._4_4_ * fVar109;
  auVar246._8_4_ = auVar43._8_4_ * fVar236;
  auVar246._12_4_ = auVar43._12_4_ * fVar220;
  auVar35 = vfmadd231ps_fma(auVar246,(undefined1  [16])aVar4,auVar35);
  auVar55 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar3,auVar136);
  local_510 = vsubps_avx(_local_590,auVar34);
  uVar104 = local_510._0_4_;
  auVar122._4_4_ = uVar104;
  auVar122._0_4_ = uVar104;
  auVar122._8_4_ = uVar104;
  auVar122._12_4_ = uVar104;
  auVar34 = vshufps_avx(local_510,local_510,0x55);
  auVar35 = vshufps_avx(local_510,local_510,0xaa);
  auVar177._0_4_ = fVar103 * auVar35._0_4_;
  auVar177._4_4_ = fVar109 * auVar35._4_4_;
  auVar177._8_4_ = fVar236 * auVar35._8_4_;
  auVar177._12_4_ = fVar220 * auVar35._12_4_;
  auVar34 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar4,auVar34);
  auVar16 = vfmadd231ps_fma(auVar34,(undefined1  [16])aVar3,auVar122);
  auVar47 = vmovlhps_avx512f(auVar48,auVar53);
  auVar43 = vmovlhps_avx(auVar50,auVar54);
  auVar42 = vmovlhps_avx(auVar51,auVar55);
  auVar49 = vmovlhps_avx(auVar52,auVar16);
  auVar35 = vminps_avx512vl(auVar47,auVar43);
  auVar46 = vmaxps_avx512vl(auVar47,auVar43);
  auVar34 = vminps_avx(auVar42,auVar49);
  auVar35 = vminps_avx(auVar35,auVar34);
  auVar34 = vmaxps_avx(auVar42,auVar49);
  auVar34 = vmaxps_avx(auVar46,auVar34);
  auVar46 = vshufpd_avx(auVar35,auVar35,3);
  auVar35 = vminps_avx(auVar35,auVar46);
  auVar46 = vshufpd_avx(auVar34,auVar34,3);
  auVar34 = vmaxps_avx(auVar34,auVar46);
  auVar35 = vandps_avx512vl(auVar35,auVar270._0_16_);
  auVar34 = vandps_avx512vl(auVar34,auVar270._0_16_);
  auVar34 = vmaxps_avx(auVar35,auVar34);
  auVar35 = vmovshdup_avx(auVar34);
  auVar34 = vmaxss_avx(auVar35,auVar34);
  fVar109 = auVar34._0_4_ * 9.536743e-07;
  auVar35 = vmovddup_avx512vl(auVar48);
  auVar46 = vmovddup_avx512vl(auVar50);
  auVar202._0_8_ = auVar51._0_8_;
  auVar202._8_8_ = auVar202._0_8_;
  auVar214._0_8_ = auVar52._0_8_;
  auVar214._8_8_ = auVar214._0_8_;
  local_3c0 = vbroadcastss_avx512vl(ZEXT416((uint)fVar109));
  auVar34 = vxorps_avx512vl(local_3c0._0_16_,auVar45);
  local_3e0 = vbroadcastss_avx512vl(auVar34);
  bVar31 = false;
  uVar23 = 0;
  fVar103 = *(float *)(ray + k * 4 + 0xc0);
  local_470 = vsubps_avx512vl(auVar43,auVar47);
  local_480 = vsubps_avx(auVar42,auVar43);
  local_490 = vsubps_avx(auVar49,auVar42);
  local_5b0 = vsubps_avx512vl(_local_560,local_520);
  local_5c0 = vsubps_avx512vl(_local_570,local_530);
  local_5d0 = vsubps_avx512vl(_local_580,local_540);
  _local_5e0 = vsubps_avx(_local_590,local_550);
  auVar108 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar108);
  auVar34 = ZEXT816(0x3f80000000000000);
  auVar82 = ZEXT1664(auVar34);
  auVar87._32_32_ = auVar108._32_32_;
  do {
    auVar272 = ZEXT3264(local_3e0);
    auVar39 = auVar82._0_16_;
    auVar48 = vshufps_avx(auVar39,auVar39,0x50);
    auVar254._8_4_ = 0x3f800000;
    auVar254._0_8_ = &DAT_3f8000003f800000;
    auVar254._12_4_ = 0x3f800000;
    auVar81._16_4_ = 0x3f800000;
    auVar81._0_16_ = auVar254;
    auVar81._20_4_ = 0x3f800000;
    auVar81._24_4_ = 0x3f800000;
    auVar81._28_4_ = 0x3f800000;
    auVar50 = vsubps_avx(auVar254,auVar48);
    fVar236 = auVar48._0_4_;
    fVar129 = auVar53._0_4_;
    auVar137._0_4_ = fVar129 * fVar236;
    fVar220 = auVar48._4_4_;
    fVar128 = auVar53._4_4_;
    auVar137._4_4_ = fVar128 * fVar220;
    fVar231 = auVar48._8_4_;
    auVar137._8_4_ = fVar129 * fVar231;
    fVar232 = auVar48._12_4_;
    auVar137._12_4_ = fVar128 * fVar232;
    fVar144 = auVar54._0_4_;
    auVar149._0_4_ = fVar144 * fVar236;
    fVar145 = auVar54._4_4_;
    auVar149._4_4_ = fVar145 * fVar220;
    auVar149._8_4_ = fVar144 * fVar231;
    auVar149._12_4_ = fVar145 * fVar232;
    fVar219 = auVar55._0_4_;
    auVar165._0_4_ = fVar219 * fVar236;
    fVar230 = auVar55._4_4_;
    auVar165._4_4_ = fVar230 * fVar220;
    auVar165._8_4_ = fVar219 * fVar231;
    auVar165._12_4_ = fVar230 * fVar232;
    fVar146 = auVar16._0_4_;
    auVar115._0_4_ = fVar146 * fVar236;
    fVar181 = auVar16._4_4_;
    auVar115._4_4_ = fVar181 * fVar220;
    auVar115._8_4_ = fVar146 * fVar231;
    auVar115._12_4_ = fVar181 * fVar232;
    auVar52 = vfmadd231ps_avx512vl(auVar137,auVar50,auVar35);
    auVar36 = vfmadd231ps_avx512vl(auVar149,auVar50,auVar46);
    auVar51 = vfmadd231ps_fma(auVar165,auVar50,auVar202);
    auVar50 = vfmadd231ps_fma(auVar115,auVar214,auVar50);
    auVar48 = vmovshdup_avx(auVar34);
    fVar220 = auVar34._0_4_;
    fVar236 = (auVar48._0_4_ - fVar220) * 0.04761905;
    auVar74._4_4_ = fVar220;
    auVar74._0_4_ = fVar220;
    auVar74._8_4_ = fVar220;
    auVar74._12_4_ = fVar220;
    auVar74._16_4_ = fVar220;
    auVar74._20_4_ = fVar220;
    auVar74._24_4_ = fVar220;
    auVar74._28_4_ = fVar220;
    auVar77._0_8_ = auVar48._0_8_;
    auVar77._8_8_ = auVar77._0_8_;
    auVar77._16_8_ = auVar77._0_8_;
    auVar77._24_8_ = auVar77._0_8_;
    auVar78 = vsubps_avx(auVar77,auVar74);
    uVar104 = auVar52._0_4_;
    auVar79._4_4_ = uVar104;
    auVar79._0_4_ = uVar104;
    auVar79._8_4_ = uVar104;
    auVar79._12_4_ = uVar104;
    auVar79._16_4_ = uVar104;
    auVar79._20_4_ = uVar104;
    auVar79._24_4_ = uVar104;
    auVar79._28_4_ = uVar104;
    auVar67._8_4_ = 1;
    auVar67._0_8_ = 0x100000001;
    auVar67._12_4_ = 1;
    auVar67._16_4_ = 1;
    auVar67._20_4_ = 1;
    auVar67._24_4_ = 1;
    auVar67._28_4_ = 1;
    auVar76 = ZEXT1632(auVar52);
    auVar75 = vpermps_avx2(auVar67,auVar76);
    auVar61 = vbroadcastss_avx512vl(auVar36);
    auVar77 = ZEXT1632(auVar36);
    auVar62 = vpermps_avx512vl(auVar67,auVar77);
    auVar63 = vbroadcastss_avx512vl(auVar51);
    auVar71 = ZEXT1632(auVar51);
    auVar64 = vpermps_avx512vl(auVar67,auVar71);
    auVar65 = vbroadcastss_avx512vl(auVar50);
    auVar73 = ZEXT1632(auVar50);
    auVar66 = vpermps_avx512vl(auVar67,auVar73);
    auVar80._4_4_ = fVar236;
    auVar80._0_4_ = fVar236;
    auVar80._8_4_ = fVar236;
    auVar80._12_4_ = fVar236;
    auVar80._16_4_ = fVar236;
    auVar80._20_4_ = fVar236;
    auVar80._24_4_ = fVar236;
    auVar80._28_4_ = fVar236;
    auVar72._8_4_ = 2;
    auVar72._0_8_ = 0x200000002;
    auVar72._12_4_ = 2;
    auVar72._16_4_ = 2;
    auVar72._20_4_ = 2;
    auVar72._24_4_ = 2;
    auVar72._28_4_ = 2;
    auVar67 = vpermps_avx512vl(auVar72,auVar76);
    auVar68 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar69 = vpermps_avx512vl(auVar68,auVar76);
    auVar76 = vpermps_avx2(auVar72,auVar77);
    auVar70 = vpermps_avx512vl(auVar68,auVar77);
    auVar77 = vpermps_avx2(auVar72,auVar71);
    auVar71 = vpermps_avx512vl(auVar68,auVar71);
    auVar72 = vpermps_avx512vl(auVar72,auVar73);
    auVar68 = vpermps_avx512vl(auVar68,auVar73);
    auVar48 = vfmadd132ps_fma(auVar78,auVar74,_DAT_02020f20);
    auVar78 = vsubps_avx(auVar81,ZEXT1632(auVar48));
    auVar73 = vmulps_avx512vl(auVar61,ZEXT1632(auVar48));
    auVar81 = ZEXT1632(auVar48);
    auVar74 = vmulps_avx512vl(auVar62,auVar81);
    auVar50 = vfmadd231ps_fma(auVar73,auVar78,auVar79);
    auVar51 = vfmadd231ps_fma(auVar74,auVar78,auVar75);
    auVar73 = vmulps_avx512vl(auVar63,auVar81);
    auVar74 = vmulps_avx512vl(auVar64,auVar81);
    auVar73 = vfmadd231ps_avx512vl(auVar73,auVar78,auVar61);
    auVar74 = vfmadd231ps_avx512vl(auVar74,auVar78,auVar62);
    auVar61 = vmulps_avx512vl(auVar65,auVar81);
    auVar79 = ZEXT1632(auVar48);
    auVar62 = vmulps_avx512vl(auVar66,auVar79);
    auVar63 = vfmadd231ps_avx512vl(auVar61,auVar78,auVar63);
    auVar64 = vfmadd231ps_avx512vl(auVar62,auVar78,auVar64);
    fVar231 = auVar48._0_4_;
    fVar232 = auVar48._4_4_;
    auVar61._4_4_ = fVar232 * auVar73._4_4_;
    auVar61._0_4_ = fVar231 * auVar73._0_4_;
    fVar233 = auVar48._8_4_;
    auVar61._8_4_ = fVar233 * auVar73._8_4_;
    fVar234 = auVar48._12_4_;
    auVar61._12_4_ = fVar234 * auVar73._12_4_;
    auVar61._16_4_ = auVar73._16_4_ * 0.0;
    auVar61._20_4_ = auVar73._20_4_ * 0.0;
    auVar61._24_4_ = auVar73._24_4_ * 0.0;
    auVar61._28_4_ = fVar220;
    auVar62._4_4_ = fVar232 * auVar74._4_4_;
    auVar62._0_4_ = fVar231 * auVar74._0_4_;
    auVar62._8_4_ = fVar233 * auVar74._8_4_;
    auVar62._12_4_ = fVar234 * auVar74._12_4_;
    auVar62._16_4_ = auVar74._16_4_ * 0.0;
    auVar62._20_4_ = auVar74._20_4_ * 0.0;
    auVar62._24_4_ = auVar74._24_4_ * 0.0;
    auVar62._28_4_ = auVar75._28_4_;
    auVar50 = vfmadd231ps_fma(auVar61,auVar78,ZEXT1632(auVar50));
    auVar51 = vfmadd231ps_fma(auVar62,auVar78,ZEXT1632(auVar51));
    auVar66._0_4_ = fVar231 * auVar63._0_4_;
    auVar66._4_4_ = fVar232 * auVar63._4_4_;
    auVar66._8_4_ = fVar233 * auVar63._8_4_;
    auVar66._12_4_ = fVar234 * auVar63._12_4_;
    auVar66._16_4_ = auVar63._16_4_ * 0.0;
    auVar66._20_4_ = auVar63._20_4_ * 0.0;
    auVar66._24_4_ = auVar63._24_4_ * 0.0;
    auVar66._28_4_ = 0;
    auVar75._4_4_ = fVar232 * auVar64._4_4_;
    auVar75._0_4_ = fVar231 * auVar64._0_4_;
    auVar75._8_4_ = fVar233 * auVar64._8_4_;
    auVar75._12_4_ = fVar234 * auVar64._12_4_;
    auVar75._16_4_ = auVar64._16_4_ * 0.0;
    auVar75._20_4_ = auVar64._20_4_ * 0.0;
    auVar75._24_4_ = auVar64._24_4_ * 0.0;
    auVar75._28_4_ = auVar63._28_4_;
    auVar52 = vfmadd231ps_fma(auVar66,auVar78,auVar73);
    auVar36 = vfmadd231ps_fma(auVar75,auVar78,auVar74);
    auVar63._28_4_ = auVar74._28_4_;
    auVar63._0_28_ =
         ZEXT1628(CONCAT412(fVar234 * auVar36._12_4_,
                            CONCAT48(fVar233 * auVar36._8_4_,
                                     CONCAT44(fVar232 * auVar36._4_4_,fVar231 * auVar36._0_4_))));
    auVar37 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar234 * auVar52._12_4_,
                                                 CONCAT48(fVar233 * auVar52._8_4_,
                                                          CONCAT44(fVar232 * auVar52._4_4_,
                                                                   fVar231 * auVar52._0_4_)))),
                              auVar78,ZEXT1632(auVar50));
    auVar38 = vfmadd231ps_fma(auVar63,auVar78,ZEXT1632(auVar51));
    auVar75 = vsubps_avx(ZEXT1632(auVar52),ZEXT1632(auVar50));
    auVar61 = vsubps_avx(ZEXT1632(auVar36),ZEXT1632(auVar51));
    auVar62 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar75 = vmulps_avx512vl(auVar75,auVar62);
    auVar61 = vmulps_avx512vl(auVar61,auVar62);
    auVar73._0_4_ = fVar236 * auVar75._0_4_;
    auVar73._4_4_ = fVar236 * auVar75._4_4_;
    auVar73._8_4_ = fVar236 * auVar75._8_4_;
    auVar73._12_4_ = fVar236 * auVar75._12_4_;
    auVar73._16_4_ = fVar236 * auVar75._16_4_;
    auVar73._20_4_ = fVar236 * auVar75._20_4_;
    auVar73._24_4_ = fVar236 * auVar75._24_4_;
    auVar73._28_4_ = 0;
    auVar75 = vmulps_avx512vl(auVar80,auVar61);
    auVar52 = vxorps_avx512vl(auVar65._0_16_,auVar65._0_16_);
    auVar61 = vpermt2ps_avx512vl(ZEXT1632(auVar37),_DAT_0205fd20,ZEXT1632(auVar52));
    auVar63 = vpermt2ps_avx512vl(ZEXT1632(auVar38),_DAT_0205fd20,ZEXT1632(auVar52));
    auVar121._0_4_ = auVar73._0_4_ + auVar37._0_4_;
    auVar121._4_4_ = auVar73._4_4_ + auVar37._4_4_;
    auVar121._8_4_ = auVar73._8_4_ + auVar37._8_4_;
    auVar121._12_4_ = auVar73._12_4_ + auVar37._12_4_;
    auVar121._16_4_ = auVar73._16_4_ + 0.0;
    auVar121._20_4_ = auVar73._20_4_ + 0.0;
    auVar121._24_4_ = auVar73._24_4_ + 0.0;
    auVar121._28_4_ = 0;
    auVar74 = ZEXT1632(auVar52);
    auVar64 = vpermt2ps_avx512vl(auVar73,_DAT_0205fd20,auVar74);
    auVar65 = vaddps_avx512vl(ZEXT1632(auVar38),auVar75);
    auVar66 = vpermt2ps_avx512vl(auVar75,_DAT_0205fd20,auVar74);
    auVar75 = vsubps_avx(auVar61,auVar64);
    auVar66 = vsubps_avx512vl(auVar63,auVar66);
    auVar64 = vmulps_avx512vl(auVar76,auVar79);
    auVar73 = vmulps_avx512vl(auVar70,auVar79);
    auVar64 = vfmadd231ps_avx512vl(auVar64,auVar78,auVar67);
    auVar67 = vfmadd231ps_avx512vl(auVar73,auVar78,auVar69);
    auVar69 = vmulps_avx512vl(auVar77,auVar79);
    auVar73 = vmulps_avx512vl(auVar71,auVar79);
    auVar76 = vfmadd231ps_avx512vl(auVar69,auVar78,auVar76);
    auVar69 = vfmadd231ps_avx512vl(auVar73,auVar78,auVar70);
    auVar70 = vmulps_avx512vl(auVar72,auVar79);
    auVar68 = vmulps_avx512vl(auVar68,auVar79);
    auVar50 = vfmadd231ps_fma(auVar70,auVar78,auVar77);
    auVar51 = vfmadd231ps_fma(auVar68,auVar78,auVar71);
    auVar68 = vmulps_avx512vl(auVar79,auVar76);
    auVar70 = vmulps_avx512vl(ZEXT1632(auVar48),auVar69);
    auVar68 = vfmadd231ps_avx512vl(auVar68,auVar78,auVar64);
    auVar67 = vfmadd231ps_avx512vl(auVar70,auVar78,auVar67);
    auVar70 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar234 * auVar50._12_4_,
                                            CONCAT48(fVar233 * auVar50._8_4_,
                                                     CONCAT44(fVar232 * auVar50._4_4_,
                                                              fVar231 * auVar50._0_4_)))),auVar78,
                         auVar76);
    auVar69 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar234 * auVar51._12_4_,
                                            CONCAT48(fVar233 * auVar51._8_4_,
                                                     CONCAT44(fVar232 * auVar51._4_4_,
                                                              fVar231 * auVar51._0_4_)))),auVar78,
                         auVar69);
    auVar76._4_4_ = fVar232 * auVar70._4_4_;
    auVar76._0_4_ = fVar231 * auVar70._0_4_;
    auVar76._8_4_ = fVar233 * auVar70._8_4_;
    auVar76._12_4_ = fVar234 * auVar70._12_4_;
    auVar76._16_4_ = auVar70._16_4_ * 0.0;
    auVar76._20_4_ = auVar70._20_4_ * 0.0;
    auVar76._24_4_ = auVar70._24_4_ * 0.0;
    auVar76._28_4_ = auVar71._28_4_;
    auVar64._4_4_ = fVar232 * auVar69._4_4_;
    auVar64._0_4_ = fVar231 * auVar69._0_4_;
    auVar64._8_4_ = fVar233 * auVar69._8_4_;
    auVar64._12_4_ = fVar234 * auVar69._12_4_;
    auVar64._16_4_ = auVar69._16_4_ * 0.0;
    auVar64._20_4_ = auVar69._20_4_ * 0.0;
    auVar64._24_4_ = auVar69._24_4_ * 0.0;
    auVar64._28_4_ = auVar77._28_4_;
    auVar76 = vfmadd231ps_avx512vl(auVar76,auVar78,auVar68);
    auVar77 = vfmadd231ps_avx512vl(auVar64,auVar67,auVar78);
    auVar78 = vsubps_avx512vl(auVar70,auVar68);
    auVar64 = vsubps_avx512vl(auVar69,auVar67);
    auVar67 = vmulps_avx512vl(auVar78,auVar62);
    auVar62 = vmulps_avx512vl(auVar64,auVar62);
    fVar220 = fVar236 * auVar67._0_4_;
    fVar231 = fVar236 * auVar67._4_4_;
    auVar78._4_4_ = fVar231;
    auVar78._0_4_ = fVar220;
    fVar232 = fVar236 * auVar67._8_4_;
    auVar78._8_4_ = fVar232;
    fVar233 = fVar236 * auVar67._12_4_;
    auVar78._12_4_ = fVar233;
    fVar234 = fVar236 * auVar67._16_4_;
    auVar78._16_4_ = fVar234;
    fVar235 = fVar236 * auVar67._20_4_;
    auVar78._20_4_ = fVar235;
    fVar236 = fVar236 * auVar67._24_4_;
    auVar78._24_4_ = fVar236;
    auVar78._28_4_ = auVar67._28_4_;
    auVar62 = vmulps_avx512vl(auVar80,auVar62);
    auVar64 = vpermt2ps_avx512vl(auVar76,_DAT_0205fd20,auVar74);
    auVar68 = vpermt2ps_avx512vl(auVar77,_DAT_0205fd20,auVar74);
    auVar218._0_4_ = auVar76._0_4_ + fVar220;
    auVar218._4_4_ = auVar76._4_4_ + fVar231;
    auVar218._8_4_ = auVar76._8_4_ + fVar232;
    auVar218._12_4_ = auVar76._12_4_ + fVar233;
    auVar218._16_4_ = auVar76._16_4_ + fVar234;
    auVar218._20_4_ = auVar76._20_4_ + fVar235;
    auVar218._24_4_ = auVar76._24_4_ + fVar236;
    auVar218._28_4_ = auVar76._28_4_ + auVar67._28_4_;
    auVar78 = vpermt2ps_avx512vl(auVar78,_DAT_0205fd20,ZEXT1632(auVar52));
    auVar67 = vaddps_avx512vl(auVar77,auVar62);
    auVar62 = vpermt2ps_avx512vl(auVar62,_DAT_0205fd20,ZEXT1632(auVar52));
    auVar78 = vsubps_avx(auVar64,auVar78);
    auVar62 = vsubps_avx512vl(auVar68,auVar62);
    auVar143 = ZEXT1632(auVar37);
    auVar69 = vsubps_avx512vl(auVar76,auVar143);
    auVar153 = ZEXT1632(auVar38);
    auVar70 = vsubps_avx512vl(auVar77,auVar153);
    auVar71 = vsubps_avx512vl(auVar64,auVar61);
    auVar69 = vaddps_avx512vl(auVar69,auVar71);
    auVar71 = vsubps_avx512vl(auVar68,auVar63);
    auVar70 = vaddps_avx512vl(auVar70,auVar71);
    auVar71 = vmulps_avx512vl(auVar153,auVar69);
    auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar143,auVar70);
    auVar72 = vmulps_avx512vl(auVar65,auVar69);
    auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar121,auVar70);
    auVar73 = vmulps_avx512vl(auVar66,auVar69);
    auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar75,auVar70);
    auVar74 = vmulps_avx512vl(auVar63,auVar69);
    auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar61,auVar70);
    auVar79 = vmulps_avx512vl(auVar77,auVar69);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar76,auVar70);
    auVar80 = vmulps_avx512vl(auVar67,auVar69);
    auVar80 = vfnmadd231ps_avx512vl(auVar80,auVar218,auVar70);
    auVar81 = vmulps_avx512vl(auVar62,auVar69);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar78,auVar70);
    auVar69 = vmulps_avx512vl(auVar68,auVar69);
    auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar64,auVar70);
    auVar70 = vminps_avx512vl(auVar71,auVar72);
    auVar71 = vmaxps_avx512vl(auVar71,auVar72);
    auVar72 = vminps_avx512vl(auVar73,auVar74);
    auVar70 = vminps_avx512vl(auVar70,auVar72);
    auVar72 = vmaxps_avx512vl(auVar73,auVar74);
    auVar71 = vmaxps_avx512vl(auVar71,auVar72);
    auVar72 = vminps_avx512vl(auVar79,auVar80);
    auVar73 = vmaxps_avx512vl(auVar79,auVar80);
    auVar74 = vminps_avx512vl(auVar81,auVar69);
    auVar72 = vminps_avx512vl(auVar72,auVar74);
    auVar70 = vminps_avx512vl(auVar70,auVar72);
    auVar69 = vmaxps_avx512vl(auVar81,auVar69);
    auVar69 = vmaxps_avx512vl(auVar73,auVar69);
    auVar69 = vmaxps_avx512vl(auVar71,auVar69);
    uVar13 = vcmpps_avx512vl(auVar70,local_3c0,2);
    uVar14 = vcmpps_avx512vl(auVar69,local_3e0,5);
    uVar28 = 0;
    bVar21 = (byte)uVar13 & (byte)uVar14 & 0x7f;
    if (bVar21 != 0) {
      auVar69 = vsubps_avx512vl(auVar61,auVar143);
      auVar70 = vsubps_avx512vl(auVar63,auVar153);
      auVar71 = vsubps_avx512vl(auVar64,auVar76);
      auVar69 = vaddps_avx512vl(auVar69,auVar71);
      auVar71 = vsubps_avx512vl(auVar68,auVar77);
      auVar70 = vaddps_avx512vl(auVar70,auVar71);
      auVar71 = vmulps_avx512vl(auVar153,auVar69);
      auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar70,auVar143);
      auVar65 = vmulps_avx512vl(auVar65,auVar69);
      auVar65 = vfnmadd213ps_avx512vl(auVar121,auVar70,auVar65);
      auVar66 = vmulps_avx512vl(auVar66,auVar69);
      auVar66 = vfnmadd213ps_avx512vl(auVar75,auVar70,auVar66);
      auVar75 = vmulps_avx512vl(auVar63,auVar69);
      auVar63 = vfnmadd231ps_avx512vl(auVar75,auVar70,auVar61);
      auVar75 = vmulps_avx512vl(auVar77,auVar69);
      auVar77 = vfnmadd231ps_avx512vl(auVar75,auVar70,auVar76);
      auVar75 = vmulps_avx512vl(auVar67,auVar69);
      auVar67 = vfnmadd213ps_avx512vl(auVar218,auVar70,auVar75);
      auVar75 = vmulps_avx512vl(auVar62,auVar69);
      auVar62 = vfnmadd213ps_avx512vl(auVar78,auVar70,auVar75);
      auVar78 = vmulps_avx512vl(auVar68,auVar69);
      auVar64 = vfnmadd231ps_avx512vl(auVar78,auVar64,auVar70);
      auVar75 = vminps_avx(auVar71,auVar65);
      auVar78 = vmaxps_avx(auVar71,auVar65);
      auVar61 = vminps_avx(auVar66,auVar63);
      auVar61 = vminps_avx(auVar75,auVar61);
      auVar75 = vmaxps_avx(auVar66,auVar63);
      auVar78 = vmaxps_avx(auVar78,auVar75);
      auVar76 = vminps_avx(auVar77,auVar67);
      auVar75 = vmaxps_avx(auVar77,auVar67);
      auVar77 = vminps_avx(auVar62,auVar64);
      auVar76 = vminps_avx(auVar76,auVar77);
      auVar76 = vminps_avx(auVar61,auVar76);
      auVar61 = vmaxps_avx(auVar62,auVar64);
      auVar75 = vmaxps_avx(auVar75,auVar61);
      auVar78 = vmaxps_avx(auVar78,auVar75);
      uVar13 = vcmpps_avx512vl(auVar78,local_3e0,5);
      uVar14 = vcmpps_avx512vl(auVar76,local_3c0,2);
      uVar28 = (uint)(bVar21 & (byte)uVar13 & (byte)uVar14);
    }
    if (uVar28 != 0) {
      auStack_620[uVar23] = uVar28;
      uVar13 = vmovlps_avx(auVar34);
      *(undefined8 *)(&uStack_460 + uVar23 * 2) = uVar13;
      uVar26 = vmovlps_avx(auVar39);
      auStack_3a0[uVar23] = uVar26;
      uVar23 = (ulong)((int)uVar23 + 1);
    }
    auVar34 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar108 = ZEXT1664(auVar34);
    auVar86._0_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar86._32_32_ = auVar87._32_32_;
    in_ZMM17 = ZEXT3264(auVar86._0_32_);
    in_ZMM22 = ZEXT464(0x38d1b717);
    auVar101._16_48_ = auVar86._16_48_;
    auVar101._0_16_ = auVar43;
    do {
      in_ZMM18 = ZEXT464(0x3e124925);
      auVar50 = auVar274._0_16_;
      auVar34 = SUB6416(ZEXT464(0xb8d1b717),0);
      auVar48 = SUB6416(ZEXT464(0x38d1b717),0);
      if ((int)uVar23 == 0) {
        if (bVar31) {
          return local_785;
        }
        uVar104 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar20._4_4_ = uVar104;
        auVar20._0_4_ = uVar104;
        auVar20._8_4_ = uVar104;
        auVar20._12_4_ = uVar104;
        uVar13 = vcmpps_avx512vl(local_5a0,auVar20,2);
        uVar30 = (uint)uVar33 & (uint)uVar33 + 0xf & (uint)uVar13;
        uVar33 = (ulong)uVar30;
        local_785 = uVar30 != 0;
        if (!local_785) {
          return local_785;
        }
        goto LAB_01c2b4a1;
      }
      uVar22 = (int)uVar23 - 1;
      uVar24 = (ulong)uVar22;
      uVar28 = (&uStack_460)[uVar24 * 2];
      fVar236 = afStack_45c[uVar24 * 2];
      uVar6 = auStack_620[uVar24];
      auVar269._8_8_ = 0;
      auVar269._0_8_ = auStack_3a0[uVar24];
      auVar82 = ZEXT1664(auVar269);
      lVar27 = 0;
      for (uVar26 = (ulong)uVar6; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      uVar25 = uVar6 - 1 & uVar6;
      auStack_620[uVar24] = uVar25;
      if (uVar25 == 0) {
        uVar23 = (ulong)uVar22;
      }
      auVar87._32_32_ = auVar101._32_32_;
      auVar52 = vpxord_avx512vl(auVar272._0_16_,auVar272._0_16_);
      auVar51 = vcvtsi2ss_avx512f(auVar52,lVar27);
      auVar36 = vmulss_avx512f(auVar51,in_ZMM18._0_16_);
      lVar27 = lVar27 + 1;
      auVar51 = vpxord_avx512vl(auVar52,auVar52);
      auVar51 = vcvtsi2ss_avx512f(auVar51,lVar27);
      auVar51 = vmulss_avx512f(auVar51,in_ZMM18._0_16_);
      auVar37 = auVar271._0_16_;
      auVar52 = vsubss_avx512f(auVar37,auVar36);
      auVar36 = vmulss_avx512f(ZEXT416((uint)fVar236),auVar36);
      auVar52 = vfmadd231ss_avx512f(auVar36,ZEXT416(uVar28),auVar52);
      auVar36 = vsubss_avx512f(auVar37,auVar51);
      auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * auVar51._0_4_)),ZEXT416(uVar28),auVar36);
      auVar36 = vsubss_avx512f(auVar51,auVar52);
      vucomiss_avx512f(auVar36);
      if (uVar6 == 0 || lVar27 == 0) break;
      auVar272 = ZEXT1664(auVar269);
      auVar38 = vshufps_avx(auVar269,auVar269,0x50);
      vucomiss_avx512f(auVar36);
      uVar28 = (uint)uVar23;
      auVar123._8_4_ = 0x3f800000;
      auVar123._0_8_ = &DAT_3f8000003f800000;
      auVar123._12_4_ = 0x3f800000;
      auVar39 = vsubps_avx(auVar123,auVar38);
      fVar236 = auVar38._0_4_;
      auVar138._0_4_ = fVar236 * fVar129;
      fVar220 = auVar38._4_4_;
      auVar138._4_4_ = fVar220 * fVar128;
      fVar231 = auVar38._8_4_;
      auVar138._8_4_ = fVar231 * fVar129;
      fVar232 = auVar38._12_4_;
      auVar138._12_4_ = fVar232 * fVar128;
      auVar150._0_4_ = fVar236 * fVar144;
      auVar150._4_4_ = fVar220 * fVar145;
      auVar150._8_4_ = fVar231 * fVar144;
      auVar150._12_4_ = fVar232 * fVar145;
      auVar166._0_4_ = fVar236 * fVar219;
      auVar166._4_4_ = fVar220 * fVar230;
      auVar166._8_4_ = fVar231 * fVar219;
      auVar166._12_4_ = fVar232 * fVar230;
      auVar116._0_4_ = fVar236 * fVar146;
      auVar116._4_4_ = fVar220 * fVar181;
      auVar116._8_4_ = fVar231 * fVar146;
      auVar116._12_4_ = fVar232 * fVar181;
      auVar38 = vfmadd231ps_fma(auVar138,auVar39,auVar35);
      auVar40 = vfmadd231ps_fma(auVar150,auVar39,auVar46);
      auVar41 = vfmadd231ps_fma(auVar166,auVar39,auVar202);
      auVar39 = vfmadd231ps_fma(auVar116,auVar39,auVar214);
      auVar65._16_16_ = auVar38;
      auVar65._0_16_ = auVar38;
      auVar68._16_16_ = auVar40;
      auVar68._0_16_ = auVar40;
      auVar70._16_16_ = auVar41;
      auVar70._0_16_ = auVar41;
      auVar38 = vbroadcastss_avx512vl(auVar52);
      uVar104 = auVar51._0_4_;
      auVar71._20_4_ = uVar104;
      auVar71._16_4_ = uVar104;
      auVar71._24_4_ = uVar104;
      auVar71._28_4_ = uVar104;
      auVar71._0_16_ = auVar38;
      auVar78 = vsubps_avx(auVar68,auVar65);
      auVar40 = vfmadd213ps_fma(auVar78,auVar71,auVar65);
      auVar78 = vsubps_avx(auVar70,auVar68);
      auVar44 = vfmadd213ps_fma(auVar78,auVar71,auVar68);
      auVar38 = vsubps_avx(auVar39,auVar41);
      auVar69._16_16_ = auVar38;
      auVar69._0_16_ = auVar38;
      auVar38 = vfmadd213ps_fma(auVar69,auVar71,auVar70);
      auVar78 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar40));
      auVar39 = vfmadd213ps_fma(auVar78,auVar71,ZEXT1632(auVar40));
      auVar78 = vsubps_avx(ZEXT1632(auVar38),ZEXT1632(auVar44));
      auVar38 = vfmadd213ps_fma(auVar78,auVar71,ZEXT1632(auVar44));
      auVar78 = vsubps_avx(ZEXT1632(auVar38),ZEXT1632(auVar39));
      auVar154 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar78,auVar71);
      auVar87._0_32_ = vmulps_avx512vl(auVar78,in_ZMM17._0_32_);
      auVar89._16_48_ = auVar87._16_48_;
      auVar38 = vmulss_avx512f(auVar36,SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar236 = auVar38._0_4_;
      auVar167._0_8_ =
           CONCAT44(auVar154._4_4_ + fVar236 * auVar87._4_4_,
                    auVar154._0_4_ + fVar236 * auVar87._0_4_);
      auVar167._8_4_ = auVar154._8_4_ + fVar236 * auVar87._8_4_;
      auVar167._12_4_ = auVar154._12_4_ + fVar236 * auVar87._12_4_;
      auVar139._0_4_ = fVar236 * auVar87._16_4_;
      auVar139._4_4_ = fVar236 * auVar87._20_4_;
      auVar139._8_4_ = fVar236 * auVar87._24_4_;
      auVar139._12_4_ = fVar236 * auVar87._28_4_;
      auVar147 = vsubps_avx((undefined1  [16])0x0,auVar139);
      auVar58 = vshufpd_avx(auVar154,auVar154,3);
      auVar59 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar38 = vsubps_avx(auVar58,auVar154);
      auVar39 = vsubps_avx(auVar59,(undefined1  [16])0x0);
      auVar186._0_4_ = auVar39._0_4_ + auVar38._0_4_;
      auVar186._4_4_ = auVar39._4_4_ + auVar38._4_4_;
      auVar186._8_4_ = auVar39._8_4_ + auVar38._8_4_;
      auVar186._12_4_ = auVar39._12_4_ + auVar38._12_4_;
      auVar38 = vshufps_avx(auVar154,auVar154,0xb1);
      auVar39 = vshufps_avx(auVar167,auVar167,0xb1);
      auVar40 = vshufps_avx(auVar147,auVar147,0xb1);
      auVar41 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar247._4_4_ = auVar186._0_4_;
      auVar247._0_4_ = auVar186._0_4_;
      auVar247._8_4_ = auVar186._0_4_;
      auVar247._12_4_ = auVar186._0_4_;
      auVar44 = vshufps_avx(auVar186,auVar186,0x55);
      fVar236 = auVar44._0_4_;
      auVar203._0_4_ = auVar38._0_4_ * fVar236;
      fVar220 = auVar44._4_4_;
      auVar203._4_4_ = auVar38._4_4_ * fVar220;
      fVar231 = auVar44._8_4_;
      auVar203._8_4_ = auVar38._8_4_ * fVar231;
      fVar232 = auVar44._12_4_;
      auVar203._12_4_ = auVar38._12_4_ * fVar232;
      auVar215._0_4_ = auVar39._0_4_ * fVar236;
      auVar215._4_4_ = auVar39._4_4_ * fVar220;
      auVar215._8_4_ = auVar39._8_4_ * fVar231;
      auVar215._12_4_ = auVar39._12_4_ * fVar232;
      auVar222._0_4_ = auVar40._0_4_ * fVar236;
      auVar222._4_4_ = auVar40._4_4_ * fVar220;
      auVar222._8_4_ = auVar40._8_4_ * fVar231;
      auVar222._12_4_ = auVar40._12_4_ * fVar232;
      auVar187._0_4_ = auVar41._0_4_ * fVar236;
      auVar187._4_4_ = auVar41._4_4_ * fVar220;
      auVar187._8_4_ = auVar41._8_4_ * fVar231;
      auVar187._12_4_ = auVar41._12_4_ * fVar232;
      auVar38 = vfmadd231ps_fma(auVar203,auVar247,auVar154);
      auVar39 = vfmadd231ps_fma(auVar215,auVar247,auVar167);
      auVar44 = vfmadd231ps_fma(auVar222,auVar247,auVar147);
      auVar60 = vfmadd231ps_fma(auVar187,(undefined1  [16])0x0,auVar247);
      auVar45 = vshufpd_avx(auVar38,auVar38,1);
      auVar56 = vshufpd_avx(auVar39,auVar39,1);
      auVar57 = vshufpd_avx(auVar44,auVar44,1);
      auVar130 = vshufpd_avx(auVar60,auVar60,1);
      auVar40 = vminss_avx(auVar38,auVar39);
      auVar38 = vmaxss_avx(auVar39,auVar38);
      auVar41 = vminss_avx(auVar44,auVar60);
      auVar39 = vmaxss_avx(auVar60,auVar44);
      auVar41 = vminss_avx(auVar40,auVar41);
      auVar38 = vmaxss_avx(auVar39,auVar38);
      auVar44 = vminss_avx(auVar45,auVar56);
      auVar39 = vmaxss_avx(auVar56,auVar45);
      auVar45 = vminss_avx(auVar57,auVar130);
      auVar40 = vmaxss_avx(auVar130,auVar57);
      auVar44 = vminss_avx(auVar44,auVar45);
      auVar39 = vmaxss_avx(auVar40,auVar39);
      auVar40 = vucomiss_avx512f(auVar41);
      in_ZMM22 = ZEXT1664(auVar40);
      if ((uVar28 < 5) || (auVar39 = vucomiss_avx512f(auVar34), uVar28 < 5)) {
        auVar38 = vucomiss_avx512f(auVar34);
        uVar13 = vcmpps_avx512vl(auVar44,auVar48,1);
        uVar14 = vcmpps_avx512vl(auVar41,auVar48,1);
        if ((4 < uVar28 & ((byte)uVar14 | (byte)uVar13)) != 0) goto LAB_01c2c767;
        uVar13 = vcmpps_avx512vl(auVar34,auVar39,5);
        uVar14 = vcmpps_avx512vl(auVar44,auVar48,5);
        if ((((ushort)uVar14 | (ushort)uVar13) & 1) == 0) goto LAB_01c2c767;
        bVar15 = true;
        auVar101._16_48_ = auVar89._16_48_;
        auVar101._0_16_ = auVar269;
        auVar82 = ZEXT1664(auVar269);
      }
      else {
LAB_01c2c767:
        uVar13 = vcmpss_avx512f(auVar41,auVar50,1);
        bVar15 = (bool)((byte)uVar13 & 1);
        iVar102 = auVar271._0_4_;
        fVar236 = (float)((uint)bVar15 * -0x40800000 + (uint)!bVar15 * iVar102);
        uVar13 = vcmpss_avx512f(auVar38,auVar50,1);
        bVar15 = (bool)((byte)uVar13 & 1);
        fVar220 = (float)((uint)bVar15 * -0x40800000 + (uint)!bVar15 * iVar102);
        bVar15 = fVar236 != fVar220;
        iVar273 = auVar274._0_4_;
        auVar89._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar88._4_60_ = auVar89._4_60_;
        auVar88._0_4_ = (uint)bVar15 * iVar273 + (uint)!bVar15 * 0x7f800000;
        auVar48 = auVar88._0_16_;
        auVar91._16_48_ = auVar89._16_48_;
        auVar91._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar90._4_60_ = auVar91._4_60_;
        auVar90._0_4_ = (uint)bVar15 * iVar273 + (uint)!bVar15 * -0x800000;
        auVar34 = auVar90._0_16_;
        uVar13 = vcmpss_avx512f(auVar44,auVar50,1);
        bVar15 = (bool)((byte)uVar13 & 1);
        fVar231 = (float)((uint)bVar15 * -0x40800000 + (uint)!bVar15 * iVar102);
        if ((fVar236 != fVar231) || (NAN(fVar236) || NAN(fVar231))) {
          fVar232 = auVar44._0_4_;
          fVar236 = auVar41._0_4_;
          bVar15 = fVar232 == fVar236;
          if ((!bVar15) || (NAN(fVar232) || NAN(fVar236))) {
            auVar19._8_4_ = 0x80000000;
            auVar19._0_8_ = 0x8000000080000000;
            auVar19._12_4_ = 0x80000000;
            auVar40 = vxorps_avx512vl(auVar41,auVar19);
            auVar260._0_4_ = auVar40._0_4_ / (fVar232 - fVar236);
            auVar260._4_12_ = auVar40._4_12_;
            auVar40 = vsubss_avx512f(auVar37,auVar260);
            auVar41 = vfmadd213ss_avx512f(auVar40,auVar50,auVar260);
            auVar40 = auVar41;
          }
          else {
            vucomiss_avx512f(auVar50);
            auVar93._16_48_ = auVar89._16_48_;
            auVar93._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar92._4_60_ = auVar93._4_60_;
            auVar92._0_4_ = (uint)bVar15 * iVar273 + (uint)!bVar15 * 0x7f800000;
            auVar41 = auVar92._0_16_;
            auVar40 = ZEXT416((uint)bVar15 * 0x3f800000 + (uint)!bVar15 * -0x800000);
          }
          auVar48 = vminss_avx(auVar48,auVar41);
          auVar34 = vmaxss_avx(auVar40,auVar34);
        }
        auVar82 = ZEXT1664(auVar269);
        uVar13 = vcmpss_avx512f(auVar39,auVar50,1);
        bVar15 = (bool)((byte)uVar13 & 1);
        fVar236 = (float)((uint)bVar15 * -0x40800000 + (uint)!bVar15 * iVar102);
        if ((fVar220 != fVar236) || (NAN(fVar220) || NAN(fVar236))) {
          fVar232 = auVar39._0_4_;
          fVar220 = auVar38._0_4_;
          bVar15 = fVar232 == fVar220;
          if ((!bVar15) || (NAN(fVar232) || NAN(fVar220))) {
            auVar18._8_4_ = 0x80000000;
            auVar18._0_8_ = 0x8000000080000000;
            auVar18._12_4_ = 0x80000000;
            auVar38 = vxorps_avx512vl(auVar38,auVar18);
            auVar223._0_4_ = auVar38._0_4_ / (fVar232 - fVar220);
            auVar223._4_12_ = auVar38._4_12_;
            auVar38 = vsubss_avx512f(auVar37,auVar223);
            auVar39 = vfmadd213ss_avx512f(auVar38,auVar50,auVar223);
            auVar38 = auVar39;
          }
          else {
            vucomiss_avx512f(auVar50);
            auVar95._16_48_ = auVar89._16_48_;
            auVar95._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar94._4_60_ = auVar95._4_60_;
            auVar94._0_4_ = (uint)bVar15 * iVar273 + (uint)!bVar15 * 0x7f800000;
            auVar39 = auVar94._0_16_;
            auVar38 = ZEXT416((uint)bVar15 * 0x3f800000 + (uint)!bVar15 * -0x800000);
          }
          auVar48 = vminss_avx(auVar48,auVar39);
          auVar34 = vmaxss_avx(auVar38,auVar34);
        }
        bVar15 = fVar231 != fVar236;
        auVar38 = vminss_avx512f(auVar48,auVar37);
        auVar97._16_48_ = auVar89._16_48_;
        auVar97._0_16_ = auVar48;
        auVar96._4_60_ = auVar97._4_60_;
        auVar96._0_4_ = (uint)bVar15 * auVar38._0_4_ + (uint)!bVar15 * auVar48._0_4_;
        auVar48 = vmaxss_avx512f(auVar37,auVar34);
        auVar99._16_48_ = auVar89._16_48_;
        auVar99._0_16_ = auVar34;
        auVar98._4_60_ = auVar99._4_60_;
        auVar98._0_4_ = (uint)bVar15 * auVar48._0_4_ + (uint)!bVar15 * auVar34._0_4_;
        auVar34 = vmaxss_avx512f(auVar50,auVar96._0_16_);
        auVar101._0_16_ = vminss_avx512f(auVar98._0_16_,auVar37);
        auVar101._16_48_ = auVar89._16_48_;
        bVar15 = true;
        if (auVar34._0_4_ <= auVar101._0_4_) {
          auVar56 = vmaxss_avx512f(auVar50,ZEXT416((uint)(auVar34._0_4_ + -0.1)));
          auVar57 = vminss_avx512f(ZEXT416((uint)(auVar101._0_4_ + 0.1)),auVar37);
          auVar117._0_8_ = auVar154._0_8_;
          auVar117._8_8_ = auVar117._0_8_;
          auVar216._8_8_ = auVar167._0_8_;
          auVar216._0_8_ = auVar167._0_8_;
          auVar224._8_8_ = auVar147._0_8_;
          auVar224._0_8_ = auVar147._0_8_;
          auVar34 = vshufpd_avx(auVar167,auVar167,3);
          auVar48 = vshufpd_avx(auVar147,auVar147,3);
          auVar38 = vshufps_avx(auVar56,auVar57,0);
          auVar248._8_4_ = 0x3f800000;
          auVar248._0_8_ = &DAT_3f8000003f800000;
          auVar248._12_4_ = 0x3f800000;
          auVar39 = vsubps_avx(auVar248,auVar38);
          fVar236 = auVar38._0_4_;
          auVar255._0_4_ = fVar236 * auVar58._0_4_;
          fVar220 = auVar38._4_4_;
          auVar255._4_4_ = fVar220 * auVar58._4_4_;
          fVar231 = auVar38._8_4_;
          auVar255._8_4_ = fVar231 * auVar58._8_4_;
          fVar232 = auVar38._12_4_;
          auVar255._12_4_ = fVar232 * auVar58._12_4_;
          auVar168._0_4_ = fVar236 * auVar34._0_4_;
          auVar168._4_4_ = fVar220 * auVar34._4_4_;
          auVar168._8_4_ = fVar231 * auVar34._8_4_;
          auVar168._12_4_ = fVar232 * auVar34._12_4_;
          auVar178._0_4_ = fVar236 * auVar48._0_4_;
          auVar178._4_4_ = fVar220 * auVar48._4_4_;
          auVar178._8_4_ = fVar231 * auVar48._8_4_;
          auVar178._12_4_ = fVar232 * auVar48._12_4_;
          auVar140._0_4_ = fVar236 * auVar59._0_4_;
          auVar140._4_4_ = fVar220 * auVar59._4_4_;
          auVar140._8_4_ = fVar231 * auVar59._8_4_;
          auVar140._12_4_ = fVar232 * auVar59._12_4_;
          auVar40 = vfmadd231ps_fma(auVar255,auVar39,auVar117);
          auVar41 = vfmadd231ps_fma(auVar168,auVar39,auVar216);
          auVar44 = vfmadd231ps_fma(auVar178,auVar39,auVar224);
          auVar45 = vfmadd231ps_fma(auVar140,auVar39,ZEXT816(0));
          auVar48 = vsubss_avx512f(auVar37,auVar56);
          auVar34 = vmovshdup_avx(auVar269);
          auVar130 = vfmadd231ss_fma(ZEXT416((uint)(auVar34._0_4_ * auVar56._0_4_)),auVar269,auVar48
                                    );
          auVar48 = vsubss_avx512f(auVar37,auVar57);
          auVar147 = vfmadd231ss_fma(ZEXT416((uint)(auVar57._0_4_ * auVar34._0_4_)),auVar269,auVar48
                                    );
          auVar39 = vdivss_avx512f(auVar37,auVar36);
          auVar34 = vsubps_avx(auVar41,auVar40);
          auVar154 = auVar108._0_16_;
          auVar36 = vmulps_avx512vl(auVar34,auVar154);
          auVar34 = vsubps_avx(auVar44,auVar41);
          auVar38 = vmulps_avx512vl(auVar34,auVar154);
          auVar34 = vsubps_avx(auVar45,auVar44);
          auVar34 = vmulps_avx512vl(auVar34,auVar154);
          auVar48 = vminps_avx(auVar38,auVar34);
          auVar34 = vmaxps_avx(auVar38,auVar34);
          auVar48 = vminps_avx(auVar36,auVar48);
          auVar34 = vmaxps_avx(auVar36,auVar34);
          auVar36 = vshufpd_avx(auVar48,auVar48,3);
          auVar38 = vshufpd_avx(auVar34,auVar34,3);
          auVar48 = vminps_avx(auVar48,auVar36);
          auVar34 = vmaxps_avx(auVar34,auVar38);
          fVar236 = auVar39._0_4_;
          auVar204._0_4_ = fVar236 * auVar48._0_4_;
          auVar204._4_4_ = fVar236 * auVar48._4_4_;
          auVar204._8_4_ = fVar236 * auVar48._8_4_;
          auVar204._12_4_ = fVar236 * auVar48._12_4_;
          auVar188._0_4_ = fVar236 * auVar34._0_4_;
          auVar188._4_4_ = fVar236 * auVar34._4_4_;
          auVar188._8_4_ = fVar236 * auVar34._8_4_;
          auVar188._12_4_ = fVar236 * auVar34._12_4_;
          auVar58 = vdivss_avx512f(auVar37,ZEXT416((uint)(auVar147._0_4_ - auVar130._0_4_)));
          auVar34 = vshufpd_avx(auVar40,auVar40,3);
          auVar48 = vshufpd_avx(auVar41,auVar41,3);
          auVar36 = vshufpd_avx(auVar44,auVar44,3);
          auVar38 = vshufpd_avx(auVar45,auVar45,3);
          auVar34 = vsubps_avx(auVar34,auVar40);
          auVar39 = vsubps_avx(auVar48,auVar41);
          auVar40 = vsubps_avx(auVar36,auVar44);
          auVar38 = vsubps_avx(auVar38,auVar45);
          auVar48 = vminps_avx(auVar34,auVar39);
          auVar34 = vmaxps_avx(auVar34,auVar39);
          auVar36 = vminps_avx(auVar40,auVar38);
          auVar36 = vminps_avx(auVar48,auVar36);
          auVar48 = vmaxps_avx(auVar40,auVar38);
          auVar34 = vmaxps_avx(auVar34,auVar48);
          fVar236 = auVar58._0_4_;
          auVar225._0_4_ = fVar236 * auVar36._0_4_;
          auVar225._4_4_ = fVar236 * auVar36._4_4_;
          auVar225._8_4_ = fVar236 * auVar36._8_4_;
          auVar225._12_4_ = fVar236 * auVar36._12_4_;
          auVar238._0_4_ = fVar236 * auVar34._0_4_;
          auVar238._4_4_ = fVar236 * auVar34._4_4_;
          auVar238._8_4_ = fVar236 * auVar34._8_4_;
          auVar238._12_4_ = fVar236 * auVar34._12_4_;
          auVar57 = vinsertps_avx512f(auVar52,auVar130,0x10);
          auVar39 = vinsertps_avx(auVar51,auVar147,0x10);
          auVar107._0_4_ = auVar57._0_4_ + auVar39._0_4_;
          auVar107._4_4_ = auVar57._4_4_ + auVar39._4_4_;
          auVar107._8_4_ = auVar57._8_4_ + auVar39._8_4_;
          auVar107._12_4_ = auVar57._12_4_ + auVar39._12_4_;
          auVar17._8_4_ = 0x3f000000;
          auVar17._0_8_ = 0x3f0000003f000000;
          auVar17._12_4_ = 0x3f000000;
          auVar59 = vmulps_avx512vl(auVar107,auVar17);
          auVar36 = vshufps_avx(auVar59,auVar59,0x54);
          uVar104 = auVar59._0_4_;
          auVar124._4_4_ = uVar104;
          auVar124._0_4_ = uVar104;
          auVar124._8_4_ = uVar104;
          auVar124._12_4_ = uVar104;
          auVar38 = vfmadd213ps_avx512vl(local_470,auVar124,auVar47);
          auVar40 = vfmadd213ps_avx512vl(local_480,auVar124,auVar43);
          auVar48 = vfmadd213ps_fma(local_490,auVar124,auVar42);
          auVar34 = vsubps_avx(auVar40,auVar38);
          auVar38 = vfmadd213ps_fma(auVar34,auVar124,auVar38);
          auVar34 = vsubps_avx(auVar48,auVar40);
          auVar34 = vfmadd213ps_fma(auVar34,auVar124,auVar40);
          auVar34 = vsubps_avx(auVar34,auVar38);
          auVar48 = vfmadd231ps_fma(auVar38,auVar34,auVar124);
          auVar41 = vmulps_avx512vl(auVar34,auVar154);
          auVar249._8_8_ = auVar48._0_8_;
          auVar249._0_8_ = auVar48._0_8_;
          auVar34 = vshufpd_avx(auVar48,auVar48,3);
          auVar48 = vshufps_avx(auVar59,auVar59,0x55);
          auVar38 = vsubps_avx(auVar34,auVar249);
          auVar40 = vfmadd231ps_fma(auVar249,auVar48,auVar38);
          auVar261._8_8_ = auVar41._0_8_;
          auVar261._0_8_ = auVar41._0_8_;
          auVar34 = vshufpd_avx(auVar41,auVar41,3);
          auVar34 = vsubps_avx(auVar34,auVar261);
          auVar48 = vfmadd213ps_fma(auVar34,auVar48,auVar261);
          auVar125._0_8_ = auVar38._0_8_ ^ 0x8000000080000000;
          auVar125._8_4_ = auVar38._8_4_ ^ 0x80000000;
          auVar125._12_4_ = auVar38._12_4_ ^ 0x80000000;
          auVar34 = vmovshdup_avx(auVar48);
          auVar262._0_8_ = auVar34._0_8_ ^ 0x8000000080000000;
          auVar262._8_4_ = auVar34._8_4_ ^ 0x80000000;
          auVar262._12_4_ = auVar34._12_4_ ^ 0x80000000;
          auVar41 = vmovshdup_avx512vl(auVar38);
          auVar44 = vpermt2ps_avx512vl(auVar262,ZEXT416(5),auVar38);
          auVar34 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar34._0_4_ * auVar38._0_4_)),auVar48,
                                        auVar41);
          auVar48 = vpermt2ps_avx512vl(auVar48,SUB6416(ZEXT464(4),0),auVar125);
          auVar141._0_4_ = auVar34._0_4_;
          auVar141._4_4_ = auVar141._0_4_;
          auVar141._8_4_ = auVar141._0_4_;
          auVar141._12_4_ = auVar141._0_4_;
          auVar34 = vdivps_avx(auVar44,auVar141);
          auVar48 = vdivps_avx(auVar48,auVar141);
          fVar220 = auVar40._0_4_;
          auVar38 = vshufps_avx(auVar40,auVar40,0x55);
          fVar236 = auVar48._0_4_;
          auVar250._0_4_ = fVar220 * auVar34._0_4_ + auVar38._0_4_ * fVar236;
          auVar250._4_4_ = fVar220 * auVar34._4_4_ + auVar38._4_4_ * auVar48._4_4_;
          auVar250._8_4_ = fVar220 * auVar34._8_4_ + auVar38._8_4_ * auVar48._8_4_;
          auVar250._12_4_ = fVar220 * auVar34._12_4_ + auVar38._12_4_ * auVar48._12_4_;
          auVar56 = vsubps_avx(auVar36,auVar250);
          auVar40 = vmovshdup_avx(auVar34);
          auVar36 = vinsertps_avx(auVar204,auVar225,0x1c);
          auVar263._0_4_ = auVar40._0_4_ * auVar36._0_4_;
          auVar263._4_4_ = auVar40._4_4_ * auVar36._4_4_;
          auVar263._8_4_ = auVar40._8_4_ * auVar36._8_4_;
          auVar263._12_4_ = auVar40._12_4_ * auVar36._12_4_;
          auVar38 = vinsertps_avx(auVar188,auVar238,0x1c);
          auVar251._0_4_ = auVar40._0_4_ * auVar38._0_4_;
          auVar251._4_4_ = auVar40._4_4_ * auVar38._4_4_;
          auVar251._8_4_ = auVar40._8_4_ * auVar38._8_4_;
          auVar251._12_4_ = auVar40._12_4_ * auVar38._12_4_;
          auVar58 = vminps_avx512vl(auVar263,auVar251);
          auVar44 = vmaxps_avx(auVar251,auVar263);
          auVar45 = vmovshdup_avx(auVar48);
          auVar40 = vinsertps_avx(auVar225,auVar204,0x4c);
          auVar226._0_4_ = auVar45._0_4_ * auVar40._0_4_;
          auVar226._4_4_ = auVar45._4_4_ * auVar40._4_4_;
          auVar226._8_4_ = auVar45._8_4_ * auVar40._8_4_;
          auVar226._12_4_ = auVar45._12_4_ * auVar40._12_4_;
          auVar41 = vinsertps_avx(auVar238,auVar188,0x4c);
          auVar239._0_4_ = auVar45._0_4_ * auVar41._0_4_;
          auVar239._4_4_ = auVar45._4_4_ * auVar41._4_4_;
          auVar239._8_4_ = auVar45._8_4_ * auVar41._8_4_;
          auVar239._12_4_ = auVar45._12_4_ * auVar41._12_4_;
          auVar45 = vminps_avx(auVar226,auVar239);
          auVar58 = vaddps_avx512vl(auVar58,auVar45);
          auVar45 = vmaxps_avx(auVar239,auVar226);
          auVar227._0_4_ = auVar44._0_4_ + auVar45._0_4_;
          auVar227._4_4_ = auVar44._4_4_ + auVar45._4_4_;
          auVar227._8_4_ = auVar44._8_4_ + auVar45._8_4_;
          auVar227._12_4_ = auVar44._12_4_ + auVar45._12_4_;
          auVar240._8_8_ = 0x3f80000000000000;
          auVar240._0_8_ = 0x3f80000000000000;
          auVar44 = vsubps_avx(auVar240,auVar227);
          auVar45 = vsubps_avx(auVar240,auVar58);
          auVar58 = vsubps_avx(auVar57,auVar59);
          auVar59 = vsubps_avx(auVar39,auVar59);
          fVar234 = auVar58._0_4_;
          auVar264._0_4_ = fVar234 * auVar44._0_4_;
          fVar235 = auVar58._4_4_;
          auVar264._4_4_ = fVar235 * auVar44._4_4_;
          fVar182 = auVar58._8_4_;
          auVar264._8_4_ = fVar182 * auVar44._8_4_;
          fVar196 = auVar58._12_4_;
          auVar264._12_4_ = fVar196 * auVar44._12_4_;
          auVar60 = vbroadcastss_avx512vl(auVar34);
          auVar36 = vmulps_avx512vl(auVar60,auVar36);
          auVar38 = vmulps_avx512vl(auVar60,auVar38);
          auVar60 = vminps_avx512vl(auVar36,auVar38);
          auVar36 = vmaxps_avx(auVar38,auVar36);
          auVar205._0_4_ = fVar236 * auVar40._0_4_;
          auVar205._4_4_ = fVar236 * auVar40._4_4_;
          auVar205._8_4_ = fVar236 * auVar40._8_4_;
          auVar205._12_4_ = fVar236 * auVar40._12_4_;
          auVar189._0_4_ = fVar236 * auVar41._0_4_;
          auVar189._4_4_ = fVar236 * auVar41._4_4_;
          auVar189._8_4_ = fVar236 * auVar41._8_4_;
          auVar189._12_4_ = fVar236 * auVar41._12_4_;
          auVar38 = vminps_avx(auVar205,auVar189);
          auVar40 = vaddps_avx512vl(auVar60,auVar38);
          auVar41 = vmulps_avx512vl(auVar58,auVar45);
          fVar220 = auVar59._0_4_;
          auVar228._0_4_ = fVar220 * auVar44._0_4_;
          fVar231 = auVar59._4_4_;
          auVar228._4_4_ = fVar231 * auVar44._4_4_;
          fVar232 = auVar59._8_4_;
          auVar228._8_4_ = fVar232 * auVar44._8_4_;
          fVar233 = auVar59._12_4_;
          auVar228._12_4_ = fVar233 * auVar44._12_4_;
          auVar241._0_4_ = fVar220 * auVar45._0_4_;
          auVar241._4_4_ = fVar231 * auVar45._4_4_;
          auVar241._8_4_ = fVar232 * auVar45._8_4_;
          auVar241._12_4_ = fVar233 * auVar45._12_4_;
          auVar38 = vmaxps_avx(auVar189,auVar205);
          auVar190._0_4_ = auVar36._0_4_ + auVar38._0_4_;
          auVar190._4_4_ = auVar36._4_4_ + auVar38._4_4_;
          auVar190._8_4_ = auVar36._8_4_ + auVar38._8_4_;
          auVar190._12_4_ = auVar36._12_4_ + auVar38._12_4_;
          auVar206._8_8_ = 0x3f800000;
          auVar206._0_8_ = 0x3f800000;
          auVar36 = vsubps_avx(auVar206,auVar190);
          auVar38 = vsubps_avx(auVar206,auVar40);
          auVar256._0_4_ = fVar234 * auVar36._0_4_;
          auVar256._4_4_ = fVar235 * auVar36._4_4_;
          auVar256._8_4_ = fVar182 * auVar36._8_4_;
          auVar256._12_4_ = fVar196 * auVar36._12_4_;
          auVar252._0_4_ = fVar234 * auVar38._0_4_;
          auVar252._4_4_ = fVar235 * auVar38._4_4_;
          auVar252._8_4_ = fVar182 * auVar38._8_4_;
          auVar252._12_4_ = fVar196 * auVar38._12_4_;
          auVar191._0_4_ = fVar220 * auVar36._0_4_;
          auVar191._4_4_ = fVar231 * auVar36._4_4_;
          auVar191._8_4_ = fVar232 * auVar36._8_4_;
          auVar191._12_4_ = fVar233 * auVar36._12_4_;
          auVar207._0_4_ = fVar220 * auVar38._0_4_;
          auVar207._4_4_ = fVar231 * auVar38._4_4_;
          auVar207._8_4_ = fVar232 * auVar38._8_4_;
          auVar207._12_4_ = fVar233 * auVar38._12_4_;
          auVar36 = vminps_avx(auVar256,auVar252);
          auVar38 = vminps_avx(auVar191,auVar207);
          auVar40 = vminps_avx(auVar36,auVar38);
          auVar36 = vmaxps_avx(auVar252,auVar256);
          auVar38 = vmaxps_avx(auVar207,auVar191);
          auVar38 = vmaxps_avx(auVar38,auVar36);
          auVar44 = vminps_avx512vl(auVar264,auVar41);
          auVar36 = vminps_avx(auVar228,auVar241);
          auVar36 = vminps_avx(auVar44,auVar36);
          auVar36 = vhaddps_avx(auVar40,auVar36);
          auVar41 = vmaxps_avx512vl(auVar41,auVar264);
          auVar40 = vmaxps_avx(auVar241,auVar228);
          auVar40 = vmaxps_avx(auVar40,auVar41);
          auVar38 = vhaddps_avx(auVar38,auVar40);
          auVar36 = vshufps_avx(auVar36,auVar36,0xe8);
          auVar38 = vshufps_avx(auVar38,auVar38,0xe8);
          auVar192._0_4_ = auVar36._0_4_ + auVar56._0_4_;
          auVar192._4_4_ = auVar36._4_4_ + auVar56._4_4_;
          auVar192._8_4_ = auVar36._8_4_ + auVar56._8_4_;
          auVar192._12_4_ = auVar36._12_4_ + auVar56._12_4_;
          auVar208._0_4_ = auVar38._0_4_ + auVar56._0_4_;
          auVar208._4_4_ = auVar38._4_4_ + auVar56._4_4_;
          auVar208._8_4_ = auVar38._8_4_ + auVar56._8_4_;
          auVar208._12_4_ = auVar38._12_4_ + auVar56._12_4_;
          auVar36 = vmaxps_avx(auVar57,auVar192);
          auVar38 = vminps_avx(auVar208,auVar39);
          uVar26 = vcmpps_avx512vl(auVar38,auVar36,1);
          auVar36 = vinsertps_avx(auVar130,auVar147,0x10);
          auVar82 = ZEXT1664(auVar36);
          if ((uVar26 & 3) == 0) {
            vucomiss_avx512f(auVar52);
            auVar101._0_16_ = auVar43;
            local_6b0 = auVar49._0_4_;
            fStack_6ac = auVar49._4_4_;
            fStack_6a8 = auVar49._8_4_;
            fStack_6a4 = auVar49._12_4_;
            if (uVar28 < 4 && (uVar6 == 0 || lVar27 == 0)) {
              bVar15 = false;
            }
            else {
              lVar27 = 200;
              do {
                auVar38 = vsubss_avx512f(auVar37,auVar56);
                fVar232 = auVar38._0_4_;
                fVar220 = fVar232 * fVar232 * fVar232;
                fVar233 = auVar56._0_4_;
                fVar231 = fVar233 * 3.0 * fVar232 * fVar232;
                fVar232 = fVar232 * fVar233 * fVar233 * 3.0;
                auVar169._4_4_ = fVar220;
                auVar169._0_4_ = fVar220;
                auVar169._8_4_ = fVar220;
                auVar169._12_4_ = fVar220;
                auVar151._4_4_ = fVar231;
                auVar151._0_4_ = fVar231;
                auVar151._8_4_ = fVar231;
                auVar151._12_4_ = fVar231;
                auVar118._4_4_ = fVar232;
                auVar118._0_4_ = fVar232;
                auVar118._8_4_ = fVar232;
                auVar118._12_4_ = fVar232;
                fVar233 = fVar233 * fVar233 * fVar233;
                auVar179._0_4_ = local_6b0 * fVar233;
                auVar179._4_4_ = fStack_6ac * fVar233;
                auVar179._8_4_ = fStack_6a8 * fVar233;
                auVar179._12_4_ = fStack_6a4 * fVar233;
                auVar38 = vfmadd231ps_fma(auVar179,auVar42,auVar118);
                auVar38 = vfmadd231ps_avx512vl(auVar38,auVar43,auVar151);
                auVar38 = vfmadd231ps_avx512vl(auVar38,auVar47,auVar169);
                auVar119._8_8_ = auVar38._0_8_;
                auVar119._0_8_ = auVar38._0_8_;
                auVar38 = vshufpd_avx(auVar38,auVar38,3);
                auVar39 = vshufps_avx(auVar56,auVar56,0x55);
                auVar38 = vsubps_avx(auVar38,auVar119);
                auVar39 = vfmadd213ps_fma(auVar38,auVar39,auVar119);
                fVar220 = auVar39._0_4_;
                auVar38 = vshufps_avx(auVar39,auVar39,0x55);
                auVar120._0_4_ = auVar34._0_4_ * fVar220 + fVar236 * auVar38._0_4_;
                auVar120._4_4_ = auVar34._4_4_ * fVar220 + auVar48._4_4_ * auVar38._4_4_;
                auVar120._8_4_ = auVar34._8_4_ * fVar220 + auVar48._8_4_ * auVar38._8_4_;
                auVar120._12_4_ = auVar34._12_4_ * fVar220 + auVar48._12_4_ * auVar38._12_4_;
                auVar56 = vsubps_avx(auVar56,auVar120);
                auVar38 = vandps_avx512vl(auVar39,auVar270._0_16_);
                auVar101._0_16_ = vprolq_avx512vl(auVar38,0x20);
                auVar38 = vmaxss_avx(auVar101._0_16_,auVar38);
                bVar32 = auVar38._0_4_ <= fVar109;
                if (auVar38._0_4_ < fVar109) {
                  auVar34 = vucomiss_avx512f(auVar50);
                  if (bVar32) {
                    auVar48 = vucomiss_avx512f(auVar34);
                    auVar271 = ZEXT1664(auVar48);
                    if (bVar32) {
                      vmovshdup_avx(auVar34);
                      auVar48 = vucomiss_avx512f(auVar50);
                      if (bVar32) {
                        auVar37 = vucomiss_avx512f(auVar48);
                        auVar271 = ZEXT1664(auVar37);
                        if (bVar32) {
                          auVar38 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar59 = vinsertps_avx(auVar38,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar38 = vdpps_avx(auVar59,local_4a0,0x7f);
                          auVar39 = vdpps_avx(auVar59,local_4b0,0x7f);
                          auVar40 = vdpps_avx(auVar59,local_4c0,0x7f);
                          auVar41 = vdpps_avx(auVar59,local_4d0,0x7f);
                          auVar44 = vdpps_avx(auVar59,local_4e0,0x7f);
                          auVar45 = vdpps_avx(auVar59,local_4f0,0x7f);
                          auVar58 = vdpps_avx(auVar59,local_500,0x7f);
                          auVar59 = vdpps_avx(auVar59,local_510,0x7f);
                          auVar56 = vsubss_avx512f(auVar37,auVar48);
                          fVar236 = auVar48._0_4_;
                          auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * auVar44._0_4_)),auVar56
                                                    ,auVar38);
                          auVar38 = vfmadd231ss_fma(ZEXT416((uint)(auVar45._0_4_ * fVar236)),auVar56
                                                    ,auVar39);
                          auVar39 = vfmadd231ss_fma(ZEXT416((uint)(auVar58._0_4_ * fVar236)),auVar56
                                                    ,auVar40);
                          auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * auVar59._0_4_)),auVar56
                                                    ,auVar41);
                          auVar101._0_16_ = vsubss_avx512f(auVar37,auVar34);
                          auVar180._0_4_ = auVar101._0_4_;
                          fVar236 = auVar180._0_4_ * auVar180._0_4_ * auVar180._0_4_;
                          fVar232 = auVar34._0_4_;
                          fVar220 = fVar232 * 3.0 * auVar180._0_4_ * auVar180._0_4_;
                          fVar231 = auVar180._0_4_ * fVar232 * fVar232 * 3.0;
                          fVar234 = fVar232 * fVar232 * fVar232;
                          auVar37 = vfmadd231ss_fma(ZEXT416((uint)(fVar234 * auVar40._0_4_)),
                                                    ZEXT416((uint)fVar231),auVar39);
                          auVar37 = vfmadd231ss_fma(auVar37,ZEXT416((uint)fVar220),auVar38);
                          auVar48 = vfmadd231ss_fma(auVar37,ZEXT416((uint)fVar236),auVar48);
                          fVar233 = auVar48._0_4_;
                          if ((fVar103 <= fVar233) &&
                             (fVar235 = *(float *)(ray + k * 4 + 0x200), fVar233 <= fVar235)) {
                            auVar48 = vshufps_avx(auVar34,auVar34,0x55);
                            auVar209._8_4_ = 0x3f800000;
                            auVar209._0_8_ = &DAT_3f8000003f800000;
                            auVar209._12_4_ = 0x3f800000;
                            auVar37 = vsubps_avx(auVar209,auVar48);
                            fVar182 = auVar48._0_4_;
                            auVar217._0_4_ = fVar182 * (float)local_560._0_4_;
                            fVar196 = auVar48._4_4_;
                            auVar217._4_4_ = fVar196 * (float)local_560._4_4_;
                            fVar197 = auVar48._8_4_;
                            auVar217._8_4_ = fVar197 * fStack_558;
                            fVar198 = auVar48._12_4_;
                            auVar217._12_4_ = fVar198 * fStack_554;
                            auVar229._0_4_ = fVar182 * (float)local_570._0_4_;
                            auVar229._4_4_ = fVar196 * (float)local_570._4_4_;
                            auVar229._8_4_ = fVar197 * fStack_568;
                            auVar229._12_4_ = fVar198 * fStack_564;
                            auVar242._0_4_ = fVar182 * (float)local_580._0_4_;
                            auVar242._4_4_ = fVar196 * (float)local_580._4_4_;
                            auVar242._8_4_ = fVar197 * fStack_578;
                            auVar242._12_4_ = fVar198 * fStack_574;
                            auVar193._0_4_ = fVar182 * (float)local_590._0_4_;
                            auVar193._4_4_ = fVar196 * (float)local_590._4_4_;
                            auVar193._8_4_ = fVar197 * fStack_588;
                            auVar193._12_4_ = fVar198 * fStack_584;
                            auVar48 = vfmadd231ps_fma(auVar217,auVar37,local_520);
                            auVar38 = vfmadd231ps_fma(auVar229,auVar37,local_530);
                            auVar39 = vfmadd231ps_fma(auVar242,auVar37,local_540);
                            auVar40 = vfmadd231ps_fma(auVar193,auVar37,local_550);
                            auVar48 = vsubps_avx(auVar38,auVar48);
                            auVar37 = vsubps_avx(auVar39,auVar38);
                            auVar38 = vsubps_avx(auVar40,auVar39);
                            auVar243._0_4_ = fVar232 * auVar37._0_4_;
                            auVar243._4_4_ = fVar232 * auVar37._4_4_;
                            auVar243._8_4_ = fVar232 * auVar37._8_4_;
                            auVar243._12_4_ = fVar232 * auVar37._12_4_;
                            auVar180._4_4_ = auVar180._0_4_;
                            auVar180._8_4_ = auVar180._0_4_;
                            auVar180._12_4_ = auVar180._0_4_;
                            auVar48 = vfmadd231ps_fma(auVar243,auVar180,auVar48);
                            auVar194._0_4_ = fVar232 * auVar38._0_4_;
                            auVar194._4_4_ = fVar232 * auVar38._4_4_;
                            auVar194._8_4_ = fVar232 * auVar38._8_4_;
                            auVar194._12_4_ = fVar232 * auVar38._12_4_;
                            auVar37 = vfmadd231ps_fma(auVar194,auVar180,auVar37);
                            auVar195._0_4_ = fVar232 * auVar37._0_4_;
                            auVar195._4_4_ = fVar232 * auVar37._4_4_;
                            auVar195._8_4_ = fVar232 * auVar37._8_4_;
                            auVar195._12_4_ = fVar232 * auVar37._12_4_;
                            auVar48 = vfmadd231ps_fma(auVar195,auVar180,auVar48);
                            auVar101._0_16_ = vmulps_avx512vl(auVar48,auVar154);
                            pGVar7 = (context->scene->geometries).items[uVar30].ptr;
                            if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                              bVar32 = false;
                            }
                            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                    (bVar32 = true,
                                    pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar170._0_4_ = fVar234 * (float)local_5e0._0_4_;
                              auVar170._4_4_ = fVar234 * (float)local_5e0._4_4_;
                              auVar170._8_4_ = fVar234 * fStack_5d8;
                              auVar170._12_4_ = fVar234 * fStack_5d4;
                              auVar152._4_4_ = fVar231;
                              auVar152._0_4_ = fVar231;
                              auVar152._8_4_ = fVar231;
                              auVar152._12_4_ = fVar231;
                              auVar48 = vfmadd132ps_fma(auVar152,auVar170,local_5d0);
                              auVar142._4_4_ = fVar220;
                              auVar142._0_4_ = fVar220;
                              auVar142._8_4_ = fVar220;
                              auVar142._12_4_ = fVar220;
                              auVar48 = vfmadd132ps_fma(auVar142,auVar48,local_5c0);
                              auVar126._4_4_ = fVar236;
                              auVar126._0_4_ = fVar236;
                              auVar126._8_4_ = fVar236;
                              auVar126._12_4_ = fVar236;
                              auVar38 = vfmadd132ps_fma(auVar126,auVar48,local_5b0);
                              auVar48 = vshufps_avx(auVar38,auVar38,0xc9);
                              auVar37 = vshufps_avx(auVar101._0_16_,auVar101._0_16_,0xc9);
                              auVar127._0_4_ = auVar38._0_4_ * auVar37._0_4_;
                              auVar127._4_4_ = auVar38._4_4_ * auVar37._4_4_;
                              auVar127._8_4_ = auVar38._8_4_ * auVar37._8_4_;
                              auVar127._12_4_ = auVar38._12_4_ * auVar37._12_4_;
                              auVar48 = vfmsub231ps_fma(auVar127,auVar101._0_16_,auVar48);
                              local_200 = vbroadcastss_avx512f(auVar34);
                              auVar82 = vbroadcastss_avx512f(ZEXT416(1));
                              local_1c0 = vpermps_avx512f(auVar82,ZEXT1664(auVar34));
                              auVar82 = vpermps_avx512f(auVar82,ZEXT1664(auVar48));
                              auVar100 = vbroadcastss_avx512f(ZEXT416(2));
                              local_280 = vpermps_avx512f(auVar100,ZEXT1664(auVar48));
                              local_240 = vbroadcastss_avx512f(auVar48);
                              local_2c0[0] = (RTCHitN)auVar82[0];
                              local_2c0[1] = (RTCHitN)auVar82[1];
                              local_2c0[2] = (RTCHitN)auVar82[2];
                              local_2c0[3] = (RTCHitN)auVar82[3];
                              local_2c0[4] = (RTCHitN)auVar82[4];
                              local_2c0[5] = (RTCHitN)auVar82[5];
                              local_2c0[6] = (RTCHitN)auVar82[6];
                              local_2c0[7] = (RTCHitN)auVar82[7];
                              local_2c0[8] = (RTCHitN)auVar82[8];
                              local_2c0[9] = (RTCHitN)auVar82[9];
                              local_2c0[10] = (RTCHitN)auVar82[10];
                              local_2c0[0xb] = (RTCHitN)auVar82[0xb];
                              local_2c0[0xc] = (RTCHitN)auVar82[0xc];
                              local_2c0[0xd] = (RTCHitN)auVar82[0xd];
                              local_2c0[0xe] = (RTCHitN)auVar82[0xe];
                              local_2c0[0xf] = (RTCHitN)auVar82[0xf];
                              local_2c0[0x10] = (RTCHitN)auVar82[0x10];
                              local_2c0[0x11] = (RTCHitN)auVar82[0x11];
                              local_2c0[0x12] = (RTCHitN)auVar82[0x12];
                              local_2c0[0x13] = (RTCHitN)auVar82[0x13];
                              local_2c0[0x14] = (RTCHitN)auVar82[0x14];
                              local_2c0[0x15] = (RTCHitN)auVar82[0x15];
                              local_2c0[0x16] = (RTCHitN)auVar82[0x16];
                              local_2c0[0x17] = (RTCHitN)auVar82[0x17];
                              local_2c0[0x18] = (RTCHitN)auVar82[0x18];
                              local_2c0[0x19] = (RTCHitN)auVar82[0x19];
                              local_2c0[0x1a] = (RTCHitN)auVar82[0x1a];
                              local_2c0[0x1b] = (RTCHitN)auVar82[0x1b];
                              local_2c0[0x1c] = (RTCHitN)auVar82[0x1c];
                              local_2c0[0x1d] = (RTCHitN)auVar82[0x1d];
                              local_2c0[0x1e] = (RTCHitN)auVar82[0x1e];
                              local_2c0[0x1f] = (RTCHitN)auVar82[0x1f];
                              local_2c0[0x20] = (RTCHitN)auVar82[0x20];
                              local_2c0[0x21] = (RTCHitN)auVar82[0x21];
                              local_2c0[0x22] = (RTCHitN)auVar82[0x22];
                              local_2c0[0x23] = (RTCHitN)auVar82[0x23];
                              local_2c0[0x24] = (RTCHitN)auVar82[0x24];
                              local_2c0[0x25] = (RTCHitN)auVar82[0x25];
                              local_2c0[0x26] = (RTCHitN)auVar82[0x26];
                              local_2c0[0x27] = (RTCHitN)auVar82[0x27];
                              local_2c0[0x28] = (RTCHitN)auVar82[0x28];
                              local_2c0[0x29] = (RTCHitN)auVar82[0x29];
                              local_2c0[0x2a] = (RTCHitN)auVar82[0x2a];
                              local_2c0[0x2b] = (RTCHitN)auVar82[0x2b];
                              local_2c0[0x2c] = (RTCHitN)auVar82[0x2c];
                              local_2c0[0x2d] = (RTCHitN)auVar82[0x2d];
                              local_2c0[0x2e] = (RTCHitN)auVar82[0x2e];
                              local_2c0[0x2f] = (RTCHitN)auVar82[0x2f];
                              local_2c0[0x30] = (RTCHitN)auVar82[0x30];
                              local_2c0[0x31] = (RTCHitN)auVar82[0x31];
                              local_2c0[0x32] = (RTCHitN)auVar82[0x32];
                              local_2c0[0x33] = (RTCHitN)auVar82[0x33];
                              local_2c0[0x34] = (RTCHitN)auVar82[0x34];
                              local_2c0[0x35] = (RTCHitN)auVar82[0x35];
                              local_2c0[0x36] = (RTCHitN)auVar82[0x36];
                              local_2c0[0x37] = (RTCHitN)auVar82[0x37];
                              local_2c0[0x38] = (RTCHitN)auVar82[0x38];
                              local_2c0[0x39] = (RTCHitN)auVar82[0x39];
                              local_2c0[0x3a] = (RTCHitN)auVar82[0x3a];
                              local_2c0[0x3b] = (RTCHitN)auVar82[0x3b];
                              local_2c0[0x3c] = (RTCHitN)auVar82[0x3c];
                              local_2c0[0x3d] = (RTCHitN)auVar82[0x3d];
                              local_2c0[0x3e] = (RTCHitN)auVar82[0x3e];
                              local_2c0[0x3f] = (RTCHitN)auVar82[0x3f];
                              local_180 = local_300._0_8_;
                              uStack_178 = local_300._8_8_;
                              uStack_170 = local_300._16_8_;
                              uStack_168 = local_300._24_8_;
                              uStack_160 = local_300._32_8_;
                              uStack_158 = local_300._40_8_;
                              uStack_150 = local_300._48_8_;
                              uStack_148 = local_300._56_8_;
                              auVar82 = vmovdqa64_avx512f(local_340);
                              local_140 = vmovdqa64_avx512f(auVar82);
                              vpcmpeqd_avx2(auVar82._0_32_,auVar82._0_32_);
                              local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                              local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]))
                              ;
                              *(float *)(ray + k * 4 + 0x200) = fVar233;
                              local_440 = local_380;
                              local_610.valid = (int *)local_440;
                              local_610.geometryUserPtr = pGVar7->userPtr;
                              local_610.context = context->user;
                              local_610.ray = (RTCRayN *)ray;
                              local_610.hit = local_2c0;
                              local_610.N = 0x10;
                              if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar7->occlusionFilterN)(&local_610);
                                in_ZMM22 = ZEXT464(0x38d1b717);
                                auVar87._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                in_ZMM17 = ZEXT3264(auVar87._32_32_);
                                auVar271 = ZEXT464(0x3f800000);
                                auVar34 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar108 = ZEXT1664(auVar34);
                                auVar34 = vxorps_avx512vl(auVar50,auVar50);
                                auVar274 = ZEXT1664(auVar34);
                                auVar34 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar270 = ZEXT1664(auVar34);
                              }
                              auVar34 = auVar274._0_16_;
                              auVar101 = vmovdqa64_avx512f(local_440);
                              uVar13 = vptestmd_avx512f(auVar101,auVar101);
                              if ((short)uVar13 == 0) {
                                bVar32 = false;
                              }
                              else {
                                p_Var12 = context->args->filter;
                                if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var12)(&local_610);
                                  in_ZMM22 = ZEXT464(0x38d1b717);
                                  auVar87._32_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  in_ZMM17 = ZEXT3264(auVar87._32_32_);
                                  auVar271 = ZEXT464(0x3f800000);
                                  auVar48 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar108 = ZEXT1664(auVar48);
                                  auVar34 = vxorps_avx512vl(auVar34,auVar34);
                                  auVar274 = ZEXT1664(auVar34);
                                  auVar34 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar270 = ZEXT1664(auVar34);
                                }
                                auVar82 = vmovdqa64_avx512f(local_440);
                                uVar26 = vptestmd_avx512f(auVar82,auVar82);
                                auVar82 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                                bVar32 = (bool)((byte)uVar26 & 1);
                                auVar101._0_4_ =
                                     (uint)bVar32 * auVar82._0_4_ |
                                     (uint)!bVar32 * *(int *)(local_610.ray + 0x200);
                                bVar32 = (bool)((byte)(uVar26 >> 1) & 1);
                                auVar101._4_4_ =
                                     (uint)bVar32 * auVar82._4_4_ |
                                     (uint)!bVar32 * *(int *)(local_610.ray + 0x204);
                                bVar32 = (bool)((byte)(uVar26 >> 2) & 1);
                                auVar101._8_4_ =
                                     (uint)bVar32 * auVar82._8_4_ |
                                     (uint)!bVar32 * *(int *)(local_610.ray + 0x208);
                                bVar32 = (bool)((byte)(uVar26 >> 3) & 1);
                                auVar101._12_4_ =
                                     (uint)bVar32 * auVar82._12_4_ |
                                     (uint)!bVar32 * *(int *)(local_610.ray + 0x20c);
                                bVar32 = (bool)((byte)(uVar26 >> 4) & 1);
                                auVar101._16_4_ =
                                     (uint)bVar32 * auVar82._16_4_ |
                                     (uint)!bVar32 * *(int *)(local_610.ray + 0x210);
                                bVar32 = (bool)((byte)(uVar26 >> 5) & 1);
                                auVar101._20_4_ =
                                     (uint)bVar32 * auVar82._20_4_ |
                                     (uint)!bVar32 * *(int *)(local_610.ray + 0x214);
                                bVar32 = (bool)((byte)(uVar26 >> 6) & 1);
                                auVar101._24_4_ =
                                     (uint)bVar32 * auVar82._24_4_ |
                                     (uint)!bVar32 * *(int *)(local_610.ray + 0x218);
                                bVar32 = (bool)((byte)(uVar26 >> 7) & 1);
                                auVar101._28_4_ =
                                     (uint)bVar32 * auVar82._28_4_ |
                                     (uint)!bVar32 * *(int *)(local_610.ray + 0x21c);
                                bVar32 = (bool)((byte)(uVar26 >> 8) & 1);
                                auVar101._32_4_ =
                                     (uint)bVar32 * auVar82._32_4_ |
                                     (uint)!bVar32 * *(int *)(local_610.ray + 0x220);
                                bVar32 = (bool)((byte)(uVar26 >> 9) & 1);
                                auVar101._36_4_ =
                                     (uint)bVar32 * auVar82._36_4_ |
                                     (uint)!bVar32 * *(int *)(local_610.ray + 0x224);
                                bVar32 = (bool)((byte)(uVar26 >> 10) & 1);
                                auVar101._40_4_ =
                                     (uint)bVar32 * auVar82._40_4_ |
                                     (uint)!bVar32 * *(int *)(local_610.ray + 0x228);
                                bVar32 = (bool)((byte)(uVar26 >> 0xb) & 1);
                                auVar101._44_4_ =
                                     (uint)bVar32 * auVar82._44_4_ |
                                     (uint)!bVar32 * *(int *)(local_610.ray + 0x22c);
                                bVar32 = (bool)((byte)(uVar26 >> 0xc) & 1);
                                auVar101._48_4_ =
                                     (uint)bVar32 * auVar82._48_4_ |
                                     (uint)!bVar32 * *(int *)(local_610.ray + 0x230);
                                bVar32 = (bool)((byte)(uVar26 >> 0xd) & 1);
                                auVar101._52_4_ =
                                     (uint)bVar32 * auVar82._52_4_ |
                                     (uint)!bVar32 * *(int *)(local_610.ray + 0x234);
                                bVar32 = (bool)((byte)(uVar26 >> 0xe) & 1);
                                auVar101._56_4_ =
                                     (uint)bVar32 * auVar82._56_4_ |
                                     (uint)!bVar32 * *(int *)(local_610.ray + 0x238);
                                bVar32 = SUB81(uVar26 >> 0xf,0);
                                auVar101._60_4_ =
                                     (uint)bVar32 * auVar82._60_4_ |
                                     (uint)!bVar32 * *(int *)(local_610.ray + 0x23c);
                                *(undefined1 (*) [64])(local_610.ray + 0x200) = auVar101;
                                bVar32 = (short)uVar26 != 0;
                              }
                              if (!bVar32) {
                                *(float *)(ray + k * 4 + 0x200) = fVar235;
                              }
                            }
                            auVar82 = ZEXT1664(auVar36);
                            bVar31 = (bool)(bVar31 | bVar32);
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar27 = lVar27 + -1;
              } while (lVar27 != 0);
            }
          }
          else {
            auVar101._0_16_ = auVar43;
          }
        }
      }
      auVar87._32_32_ = auVar101._32_32_;
    } while (bVar15);
    auVar34 = vinsertps_avx512f(auVar52,auVar51,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }